

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestUpdate(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int p_col,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *p_work,int num,int *nonz)

{
  uint *puVar1;
  uint *puVar2;
  fpclass_type fVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int32_t iVar9;
  undefined4 uVar10;
  cpp_dec_float<50u,int,void> cVar11;
  undefined1 auVar12 [16];
  int iVar13;
  long lVar14;
  undefined8 *puVar15;
  uint uVar16;
  int iVar17;
  fpclass_type *pfVar18;
  int iVar19;
  int *piVar20;
  ulong uVar21;
  cpp_dec_float<50U,_int,_void> *pcVar22;
  fpclass_type *pfVar23;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  uint uVar25;
  int *piVar26;
  cpp_dec_float<50U,_int,_void> *pcVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  int *piVar32;
  uint uVar33;
  int *piVar34;
  pointer pnVar35;
  uint uVar36;
  cpp_dec_float<50U,_int,_void> *pcVar37;
  cpp_dec_float<50u,int,void> *this_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pCVar38;
  Real RVar39;
  double a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  undefined1 local_318 [48];
  undefined8 local_2e8;
  uint *local_2e0;
  undefined1 local_2d8 [48];
  undefined8 local_2a8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_298;
  fpclass_type *local_290;
  pointer local_288;
  int *local_280;
  int *local_278;
  ulong local_270;
  pointer local_268;
  fpclass_type *local_260;
  int *local_258;
  pointer local_250;
  int *local_248;
  undefined8 uStack_240;
  long local_230;
  int *local_228;
  int *local_220;
  int *local_218;
  int *local_210;
  int *local_208;
  int *local_200;
  int *local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [56];
  int *local_1b0;
  pointer local_1a8;
  int *local_1a0;
  int *local_198;
  int *local_190;
  cpp_dec_float<50U,_int,_void> local_188;
  cpp_dec_float<50U,_int,_void> local_148;
  undefined8 local_108;
  undefined8 uStack_100;
  uint local_f8 [2];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8 [2];
  undefined8 uStack_c0;
  undefined8 local_b8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_2e8 = (int *)0xa00000000;
  local_318._0_4_ = 0;
  local_318._4_4_ = 0;
  local_318._8_4_ = 0;
  local_318._12_4_ = 0;
  local_318._16_4_ = 0;
  local_318._20_4_ = 0;
  local_318._24_4_ = 0;
  local_318._28_4_ = 0;
  local_318._32_4_ = 0;
  local_318._36_4_ = 0;
  local_318._40_4_ = 0;
  local_318[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
  local_190 = (this->l).start;
  piVar34 = (this->u).col.idx;
  local_1b0 = (this->u).col.max;
  local_228 = (this->u).col.len;
  local_220 = (this->u).col.start;
  pnVar35 = (this->u).row.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_278 = (this->u).row.idx;
  local_198 = (this->u).row.max;
  piVar20 = (this->u).row.len;
  local_218 = (this->u).row.start;
  local_1a0 = (this->row).orig;
  local_210 = (this->row).perm;
  local_1a8 = (pointer)(this->col).perm;
  local_200 = (this->col).orig;
  uVar4 = *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 8);
  local_1e8._32_4_ = (undefined4)uVar4;
  local_1e8._36_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  uVar4 = *(undefined8 *)(this->maxabs).m_backend.data._M_elems;
  uVar6 = *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2);
  uVar7 = *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4);
  uVar8 = *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 6);
  local_1e8._16_4_ = (undefined4)uVar7;
  local_1e8._20_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  local_1e8._24_4_ = (undefined4)uVar8;
  local_1e8._28_4_ = (undefined4)((ulong)uVar8 >> 0x20);
  local_1e8._0_4_ = (undefined4)uVar4;
  local_1e8._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  local_1e8._8_4_ = (undefined4)uVar6;
  local_1e8._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
  local_1e8._40_4_ = (this->maxabs).m_backend.exp;
  local_1e8[0x2c] = (cpp_dec_float<50u,int,void>)(this->maxabs).m_backend.neg;
  local_1e8._48_8_ = *(undefined8 *)&(this->maxabs).m_backend.fpclass;
  uVar16 = this->thedim;
  local_280 = (int *)(ulong)uVar16;
  local_270 = (ulong)p_col;
  iVar13 = local_220[local_270];
  iVar19 = local_228[local_270];
  this->nzCnt = this->nzCnt - iVar19;
  iVar19 = iVar13 + iVar19 + -1;
  if (iVar13 <= iVar19) {
    lVar14 = (long)iVar19;
    do {
      iVar19 = piVar34[lVar14];
      lVar31 = (long)local_218[iVar19];
      iVar17 = piVar20[iVar19];
      piVar20[iVar19] = (int)((long)iVar17 + -1);
      pfVar23 = &pnVar35[lVar31 + -1].m_backend.fpclass;
      piVar26 = local_278 + lVar31;
      do {
        piVar32 = piVar26;
        pfVar18 = pfVar23;
        pfVar23 = pfVar18 + 0xe;
        piVar26 = piVar32 + 1;
      } while (*piVar32 != p_col);
      lVar31 = (long)iVar17 + -1 + lVar31;
      *piVar32 = local_278[lVar31];
      *(undefined8 *)(pfVar18 + 10) =
           *(undefined8 *)((long)pnVar35[lVar31].m_backend.data._M_elems + 0x20);
      uVar4 = *(undefined8 *)pnVar35[lVar31].m_backend.data._M_elems;
      uVar6 = *(undefined8 *)((long)pnVar35[lVar31].m_backend.data._M_elems + 8);
      puVar1 = (uint *)((long)pnVar35[lVar31].m_backend.data._M_elems + 0x10);
      uVar7 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)(pfVar18 + 6) = *(undefined8 *)puVar1;
      *(undefined8 *)(pfVar18 + 8) = uVar7;
      *(undefined8 *)(pfVar18 + 2) = uVar4;
      *(undefined8 *)(pfVar18 + 4) = uVar6;
      pfVar18[0xc] = pnVar35[lVar31].m_backend.exp;
      *(bool *)(pfVar18 + 0xd) = pnVar35[lVar31].m_backend.neg;
      *(undefined8 *)(pfVar18 + 0xe) = *(undefined8 *)&pnVar35[lVar31].m_backend.fpclass;
      bVar5 = iVar13 < lVar14;
      lVar14 = lVar14 + -1;
    } while (bVar5);
  }
  local_298 = this;
  local_2e0 = (uint *)nonz;
  local_208 = piVar20;
  if (num == 0) {
    local_258 = (this->u).col.idx;
    local_250 = (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    iVar13 = local_220[local_270];
    if ((int)uVar16 < 1) {
      local_290 = (fpclass_type *)0x0;
      iVar19 = iVar13;
    }
    else {
      local_230 = CONCAT44(local_230._4_4_,local_1b0[local_270] + iVar13);
      piVar34 = (int *)0x0;
      local_260 = (fpclass_type *)CONCAT44(local_260._4_4_,uVar16);
      local_268 = (pointer)CONCAT44(local_268._4_4_,iVar13);
      local_290 = (fpclass_type *)0x0;
      this_00 = (cpp_dec_float<50u,int,void> *)p_work;
      do {
        local_318._32_4_ = (undefined4)*(undefined8 *)(this_00 + 0x20);
        local_318._36_4_ = (undefined4)((ulong)*(undefined8 *)(this_00 + 0x20) >> 0x20);
        local_318._16_4_ = (undefined4)*(undefined8 *)(this_00 + 0x10);
        local_318._20_4_ = (undefined4)((ulong)*(undefined8 *)(this_00 + 0x10) >> 0x20);
        local_318._24_4_ = (undefined4)*(undefined8 *)(this_00 + 0x18);
        local_318._28_4_ = (undefined4)((ulong)*(undefined8 *)(this_00 + 0x18) >> 0x20);
        local_318._0_4_ = (undefined4)*(undefined8 *)this_00;
        local_318._4_4_ = (undefined4)((ulong)*(undefined8 *)this_00 >> 0x20);
        local_318._8_4_ = (undefined4)*(undefined8 *)(this_00 + 8);
        local_318._12_4_ = (undefined4)((ulong)*(undefined8 *)(this_00 + 8) >> 0x20);
        local_318._40_4_ = *(undefined4 *)(this_00 + 0x28);
        local_318[0x2c] = this_00[0x2c];
        local_2e8 = *(int **)(this_00 + 0x30);
        local_288 = pnVar35;
        local_248 = piVar34;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(this_00,0.0);
        piVar34 = local_2e8;
        cVar11 = local_318[0x2c];
        uVar10 = local_318._40_4_;
        local_108 = CONCAT44(local_318._4_4_,local_318._0_4_);
        uStack_100 = CONCAT44(local_318._12_4_,local_318._8_4_);
        local_f8[1] = local_318._20_4_;
        local_f8[0] = local_318._16_4_;
        uStack_f0 = CONCAT44(local_318._28_4_,local_318._24_4_);
        local_e8 = CONCAT44(local_318._36_4_,local_318._32_4_);
        local_1f8 = local_2e8;
        uStack_1f0 = 0;
        RVar39 = Tolerances::epsilonUpdate
                           ((local_298->_tolerances).
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
        local_a8.fpclass = cpp_dec_float_finite;
        local_a8.prec_elem = 10;
        local_a8.data._M_elems[0] = 0;
        local_a8.data._M_elems[1] = 0;
        local_a8.data._M_elems[2] = 0;
        local_a8.data._M_elems[3] = 0;
        local_a8.data._M_elems[4] = 0;
        local_a8.data._M_elems[5] = 0;
        local_a8.data._M_elems._24_5_ = 0;
        local_a8.data._M_elems[7]._1_3_ = 0;
        local_a8.data._M_elems._32_5_ = 0;
        local_a8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_a8,RVar39);
        piVar20 = local_208;
        pnVar35 = local_288;
        local_2d8._32_5_ = (undefined5)local_e8;
        local_2d8._37_3_ = (undefined3)((ulong)local_e8 >> 0x28);
        local_2d8._16_4_ = local_f8[0];
        local_2d8._20_4_ = local_f8[1];
        local_2d8._24_5_ = (undefined5)uStack_f0;
        local_2d8._29_3_ = (undefined3)((ulong)uStack_f0 >> 0x28);
        local_2d8._8_8_ = uStack_100;
        local_2d8._0_8_ = local_108;
        auVar12 = local_2d8._0_16_;
        local_2d8._40_4_ = uVar10;
        local_2d8[0x2c] = cVar11;
        local_2a8 = piVar34;
        if ((cVar11 == (cpp_dec_float<50u,int,void>)0x1) &&
           (local_2d8._0_4_ = (undefined4)local_108, local_2d8._0_4_ != 0 || (int)local_1f8 != 0)) {
          local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
        }
        local_2d8._0_16_ = auVar12;
        if ((((int)local_1f8 != 2) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_2d8,&local_a8), 0 < iVar13))
        {
          local_2d8._32_5_ = (undefined5)CONCAT44(local_318._36_4_,local_318._32_4_);
          local_2d8._37_3_ = SUB43(local_318._36_4_,1);
          local_2d8._4_4_ = local_318._4_4_;
          local_2d8._0_4_ = local_318._0_4_;
          local_2d8._12_4_ = local_318._12_4_;
          local_2d8._8_4_ = local_318._8_4_;
          local_2d8._20_4_ = local_318._20_4_;
          local_2d8._16_4_ = local_318._16_4_;
          local_2d8._24_5_ = (undefined5)CONCAT44(local_318._28_4_,local_318._24_4_);
          local_2d8._29_3_ = SUB43(local_318._28_4_,1);
          local_2d8._40_4_ = local_318._40_4_;
          local_2d8[0x2c] = local_318[0x2c];
          local_2a8 = local_2e8;
          if ((local_318[0x2c] == (cpp_dec_float<50u,int,void>)0x1) &&
             (local_318._0_4_ != 0 || (int)local_2e8 != 0)) {
            local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
          }
          if ((((int)local_2e8 != 2) && (local_1e8._48_4_ != cpp_dec_float_NaN)) &&
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_2d8,
                                  (cpp_dec_float<50U,_int,_void> *)local_1e8), 0 < iVar13)) {
            local_1e8[0x2c] = local_318[0x2c];
            if (local_318[0x2c] == (cpp_dec_float<50u,int,void>)0x1) {
              local_1e8[0x2c] =
                   (cpp_dec_float<50u,int,void>)((int)local_2e8 == 0 && local_318._0_4_ == 0);
            }
            local_1e8._0_4_ = local_318._0_4_;
            local_1e8._36_4_ = local_318._36_4_;
            local_1e8._20_4_ = local_318._20_4_;
            local_1e8._24_4_ = local_318._24_4_;
            local_1e8._28_4_ = local_318._28_4_;
            local_1e8._32_4_ = local_318._32_4_;
            local_1e8._4_4_ = local_318._4_4_;
            local_1e8._8_4_ = local_318._8_4_;
            local_1e8._12_4_ = local_318._12_4_;
            local_1e8._16_4_ = local_318._16_4_;
            local_1e8._40_4_ = local_318._40_4_;
            local_1e8._48_8_ = local_2e8;
          }
          piVar34 = local_220;
          uVar21 = local_270;
          pCVar38 = local_298;
          iVar13 = (int)local_268;
          if ((int)local_230 <= (int)local_268) {
            local_228[local_270] = (int)local_268 - local_220[local_270];
            forestReMaxCol(local_298,p_col,(int)local_260);
            local_258 = (pCVar38->u).col.idx;
            local_250 = (pCVar38->u).col.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_230 = CONCAT44(local_230._4_4_,local_1b0[uVar21] + piVar34[uVar21]);
            pnVar35 = local_288;
            piVar20 = local_208;
            iVar13 = piVar34[uVar21] + local_228[uVar21];
          }
          pCVar38 = local_298;
          *(ulong *)((long)local_250[iVar13].m_backend.data._M_elems + 0x20) =
               CONCAT44(local_318._36_4_,local_318._32_4_);
          puVar1 = (uint *)((long)local_250[iVar13].m_backend.data._M_elems + 0x10);
          *(ulong *)puVar1 = CONCAT44(local_318._20_4_,local_318._16_4_);
          *(ulong *)(puVar1 + 2) = CONCAT44(local_318._28_4_,local_318._24_4_);
          *(ulong *)local_250[iVar13].m_backend.data._M_elems =
               CONCAT44(local_318._4_4_,local_318._0_4_);
          *(ulong *)((long)local_250[iVar13].m_backend.data._M_elems + 8) =
               CONCAT44(local_318._12_4_,local_318._8_4_);
          local_250[iVar13].m_backend.exp = local_318._40_4_;
          local_250[iVar13].m_backend.neg = (bool)local_318[0x2c];
          *(int **)&local_250[iVar13].m_backend.fpclass = local_2e8;
          local_258[iVar13] = (int)local_248;
          iVar19 = piVar20[(long)local_248];
          local_268._0_4_ = iVar13;
          if (local_198[(long)local_248] <= iVar19) {
            remaxRow(local_298,(int)local_248,iVar19 + 1);
            pnVar35 = (pCVar38->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_278 = (pCVar38->u).row.idx;
            iVar19 = piVar20[(long)local_248];
          }
          local_268 = (pointer)CONCAT44(local_268._4_4_,(int)local_268 + 1);
          iVar13 = local_218[(long)local_248];
          piVar20[(long)local_248] = iVar19 + 1;
          lVar14 = (long)iVar19 + (long)iVar13;
          *(ulong *)((long)pnVar35[lVar14].m_backend.data._M_elems + 0x20) =
               CONCAT44(local_318._36_4_,local_318._32_4_);
          puVar1 = (uint *)((long)pnVar35[lVar14].m_backend.data._M_elems + 0x10);
          *(ulong *)puVar1 = CONCAT44(local_318._20_4_,local_318._16_4_);
          *(ulong *)(puVar1 + 2) = CONCAT44(local_318._28_4_,local_318._24_4_);
          *(ulong *)pnVar35[lVar14].m_backend.data._M_elems =
               CONCAT44(local_318._4_4_,local_318._0_4_);
          *(ulong *)((long)pnVar35[lVar14].m_backend.data._M_elems + 8) =
               CONCAT44(local_318._12_4_,local_318._8_4_);
          pnVar35[lVar14].m_backend.exp = local_318._40_4_;
          pnVar35[lVar14].m_backend.neg = (bool)local_318[0x2c];
          *(int **)&pnVar35[lVar14].m_backend.fpclass = local_2e8;
          local_278[lVar14] = p_col;
          iVar13 = (int)local_290;
          local_290 = (fpclass_type *)((ulong)local_290 & 0xffffffff);
          if (iVar13 < local_210[(long)local_248]) {
            local_290 = (fpclass_type *)(ulong)(uint)local_210[(long)local_248];
          }
        }
        piVar34 = (int *)((long)local_248 + 1);
        local_260 = (fpclass_type *)CONCAT44(local_260._4_4_,(int)local_260 + -1);
        this_00 = this_00 + 0x38;
      } while (local_280 != piVar34);
      iVar13 = local_220[local_270];
      iVar19 = (int)local_268;
    }
    local_228[local_270] = iVar19 - iVar13;
    local_298->nzCnt = local_298->nzCnt + (iVar19 - iVar13);
    if (local_1b0[local_270] + local_220[local_270] == (local_298->u).col.used) {
      (local_298->u).col.used = local_220[local_270];
      iVar13 = local_228[local_270];
      local_1b0[local_270] = iVar13;
      piVar34 = &(local_298->u).col.used;
      *piVar34 = *piVar34 + iVar13;
    }
  }
  else {
    local_228[local_270] = 0;
    if (local_1b0[local_270] < num) {
      forestReMaxCol(this,p_col,num);
    }
    local_258 = (this->u).col.idx;
    local_250 = (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    iVar13 = local_220[local_270];
    if (num < 1) {
      local_290 = (fpclass_type *)0x0;
      iVar19 = iVar13;
    }
    else {
      local_260 = (fpclass_type *)(ulong)(uint)num;
      uVar21 = 0;
      local_268 = (pointer)CONCAT44(local_268._4_4_,iVar13);
      local_290 = (fpclass_type *)0x0;
      do {
        local_1f8 = (int *)(long)(int)local_2e0[uVar21];
        uVar4 = *(undefined8 *)(p_work[(long)local_1f8].m_backend.data._M_elems + 8);
        local_318._32_4_ = (undefined4)uVar4;
        local_318._36_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)p_work[(long)local_1f8].m_backend.data._M_elems;
        uVar6 = *(undefined8 *)(p_work[(long)local_1f8].m_backend.data._M_elems + 2);
        puVar1 = p_work[(long)local_1f8].m_backend.data._M_elems + 4;
        uVar7 = *(undefined8 *)puVar1;
        uVar8 = *(undefined8 *)(puVar1 + 2);
        local_318._16_4_ = (undefined4)uVar7;
        local_318._20_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        local_318._24_4_ = (undefined4)uVar8;
        local_318._28_4_ = (undefined4)((ulong)uVar8 >> 0x20);
        local_318._0_4_ = (undefined4)uVar4;
        local_318._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        local_318._8_4_ = (undefined4)uVar6;
        local_318._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
        local_318._40_4_ = p_work[(long)local_1f8].m_backend.exp;
        local_318[0x2c] = (cpp_dec_float<50u,int,void>)p_work[(long)local_1f8].m_backend.neg;
        local_2e8 = *(int **)&p_work[(long)local_1f8].m_backend.fpclass;
        local_288 = pnVar35;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)(p_work + (long)local_1f8),0.0);
        piVar34 = local_2e8;
        cVar11 = local_318[0x2c];
        uVar10 = local_318._40_4_;
        local_d8 = CONCAT44(local_318._4_4_,local_318._0_4_);
        uStack_d0 = CONCAT44(local_318._12_4_,local_318._8_4_);
        local_c8[1] = local_318._20_4_;
        local_c8[0] = local_318._16_4_;
        uStack_c0 = CONCAT44(local_318._28_4_,local_318._24_4_);
        local_b8 = CONCAT44(local_318._36_4_,local_318._32_4_);
        local_248 = local_2e8;
        uStack_240 = 0;
        RVar39 = Tolerances::epsilonUpdate
                           ((this->_tolerances).
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,RVar39);
        piVar20 = local_208;
        pnVar35 = local_288;
        this = local_298;
        local_2d8._32_5_ = (undefined5)local_b8;
        local_2d8._37_3_ = (undefined3)((ulong)local_b8 >> 0x28);
        local_2d8._16_4_ = local_c8[0];
        local_2d8._20_4_ = local_c8[1];
        local_2d8._24_5_ = (undefined5)uStack_c0;
        local_2d8._29_3_ = (undefined3)((ulong)uStack_c0 >> 0x28);
        local_2d8._8_8_ = uStack_d0;
        local_2d8._0_8_ = local_d8;
        auVar12 = local_2d8._0_16_;
        local_2d8._40_4_ = uVar10;
        local_2d8[0x2c] = cVar11;
        local_2a8 = piVar34;
        if ((cVar11 == (cpp_dec_float<50u,int,void>)0x1) &&
           (local_2d8._0_4_ = (undefined4)local_d8, local_2d8._0_4_ != 0 || (uint)local_248 != 0)) {
          local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
        }
        local_2d8._0_16_ = auVar12;
        if ((((uint)local_248 != 2) && (local_68.fpclass != cpp_dec_float_NaN)) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_2d8,&local_68), 0 < iVar13))
        {
          local_2d8._32_5_ = (undefined5)CONCAT44(local_318._36_4_,local_318._32_4_);
          local_2d8._37_3_ = SUB43(local_318._36_4_,1);
          local_2d8._4_4_ = local_318._4_4_;
          local_2d8._0_4_ = local_318._0_4_;
          local_2d8._12_4_ = local_318._12_4_;
          local_2d8._8_4_ = local_318._8_4_;
          local_2d8._20_4_ = local_318._20_4_;
          local_2d8._16_4_ = local_318._16_4_;
          local_2d8._24_5_ = (undefined5)CONCAT44(local_318._28_4_,local_318._24_4_);
          local_2d8._29_3_ = SUB43(local_318._28_4_,1);
          local_2d8._40_4_ = local_318._40_4_;
          local_2d8[0x2c] = local_318[0x2c];
          local_2a8 = local_2e8;
          if ((local_318[0x2c] == (cpp_dec_float<50u,int,void>)0x1) &&
             (local_318._0_4_ != 0 || (int)local_2e8 != 0)) {
            local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
          }
          if ((((int)local_2e8 != 2) && (local_1e8._48_4_ != cpp_dec_float_NaN)) &&
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_2d8,
                                  (cpp_dec_float<50U,_int,_void> *)local_1e8), 0 < iVar13)) {
            local_1e8[0x2c] = local_318[0x2c];
            if (local_318[0x2c] == (cpp_dec_float<50u,int,void>)0x1) {
              local_1e8[0x2c] =
                   (cpp_dec_float<50u,int,void>)((int)local_2e8 == 0 && local_318._0_4_ == 0);
            }
            local_1e8._0_4_ = local_318._0_4_;
            local_1e8._36_4_ = local_318._36_4_;
            local_1e8._20_4_ = local_318._20_4_;
            local_1e8._24_4_ = local_318._24_4_;
            local_1e8._28_4_ = local_318._28_4_;
            local_1e8._32_4_ = local_318._32_4_;
            local_1e8._4_4_ = local_318._4_4_;
            local_1e8._8_4_ = local_318._8_4_;
            local_1e8._12_4_ = local_318._12_4_;
            local_1e8._16_4_ = local_318._16_4_;
            local_1e8._40_4_ = local_318._40_4_;
            local_1e8._48_8_ = local_2e8;
          }
          lVar14 = (long)(int)local_268;
          *(ulong *)((long)local_250[lVar14].m_backend.data._M_elems + 0x20) =
               CONCAT44(local_318._36_4_,local_318._32_4_);
          puVar1 = (uint *)((long)local_250[lVar14].m_backend.data._M_elems + 0x10);
          *(ulong *)puVar1 = CONCAT44(local_318._20_4_,local_318._16_4_);
          *(ulong *)(puVar1 + 2) = CONCAT44(local_318._28_4_,local_318._24_4_);
          *(ulong *)local_250[lVar14].m_backend.data._M_elems =
               CONCAT44(local_318._4_4_,local_318._0_4_);
          *(ulong *)((long)local_250[lVar14].m_backend.data._M_elems + 8) =
               CONCAT44(local_318._12_4_,local_318._8_4_);
          local_250[lVar14].m_backend.exp = local_318._40_4_;
          local_250[lVar14].m_backend.neg = (bool)local_318[0x2c];
          *(int **)&local_250[lVar14].m_backend.fpclass = local_2e8;
          local_258[lVar14] = (int)local_1f8;
          iVar13 = piVar20[(long)local_1f8];
          if (local_198[(long)local_1f8] <= iVar13) {
            remaxRow(this,(int)local_1f8,iVar13 + 1);
            pnVar35 = (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_278 = (this->u).row.idx;
            iVar13 = piVar20[(long)local_1f8];
          }
          local_268 = (pointer)CONCAT44(local_268._4_4_,(int)local_268 + 1);
          iVar19 = local_218[(long)local_1f8];
          piVar20[(long)local_1f8] = iVar13 + 1;
          lVar14 = (long)iVar13 + (long)iVar19;
          *(ulong *)((long)pnVar35[lVar14].m_backend.data._M_elems + 0x20) =
               CONCAT44(local_318._36_4_,local_318._32_4_);
          puVar1 = (uint *)((long)pnVar35[lVar14].m_backend.data._M_elems + 0x10);
          *(ulong *)puVar1 = CONCAT44(local_318._20_4_,local_318._16_4_);
          *(ulong *)(puVar1 + 2) = CONCAT44(local_318._28_4_,local_318._24_4_);
          *(ulong *)pnVar35[lVar14].m_backend.data._M_elems =
               CONCAT44(local_318._4_4_,local_318._0_4_);
          *(ulong *)((long)pnVar35[lVar14].m_backend.data._M_elems + 8) =
               CONCAT44(local_318._12_4_,local_318._8_4_);
          pnVar35[lVar14].m_backend.exp = local_318._40_4_;
          pnVar35[lVar14].m_backend.neg = (bool)local_318[0x2c];
          *(int **)&pnVar35[lVar14].m_backend.fpclass = local_2e8;
          local_278[lVar14] = p_col;
          iVar13 = (int)local_290;
          local_290 = (fpclass_type *)((ulong)local_290 & 0xffffffff);
          if (iVar13 < local_210[(long)local_1f8]) {
            local_290 = (fpclass_type *)(ulong)(uint)local_210[(long)local_1f8];
          }
        }
        uVar21 = uVar21 + 1;
      } while (local_260 != (fpclass_type *)uVar21);
      iVar13 = local_220[local_270];
      iVar19 = (int)local_268;
    }
    local_228[local_270] = iVar19 - iVar13;
    this->nzCnt = this->nzCnt + (iVar19 - iVar13);
  }
  piVar34 = local_1a0;
  pfVar23 = local_290;
  iVar13 = *(int *)((long)local_1a8 + local_270 * 4);
  iVar19 = (int)local_290;
  uVar16 = iVar19 - iVar13;
  if (uVar16 == 0 || iVar19 < iVar13) {
    if (uVar16 != 0) {
      local_298->stat = SINGULAR;
      puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_2d8._0_8_ = local_2d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d8,"XFORE03 The loaded matrix is singular","");
      *puVar15 = &PTR__SPxException_003adbd8;
      puVar15[1] = puVar15 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar15 + 1),local_2d8._0_8_,
                 (undefined1 *)(local_2d8._0_8_ + local_2d8._8_8_));
      *puVar15 = &PTR__SPxException_003aea68;
      __cxa_throw(puVar15,&SPxStatusException::typeinfo,SPxException::~SPxException);
    }
    iVar13 = local_1a0[(ulong)local_290 & 0xffffffff];
    iVar19 = local_218[iVar13];
    iVar17 = piVar20[iVar13];
    piVar20[iVar13] = iVar17 + -1;
    local_188.fpclass = cpp_dec_float_finite;
    local_188.prec_elem = 10;
    local_188.data._M_elems[0] = 0;
    local_188.data._M_elems[1] = 0;
    local_188.data._M_elems[2] = 0;
    local_188.data._M_elems[3] = 0;
    local_188.data._M_elems[4] = 0;
    local_188.data._M_elems[5] = 0;
    local_188.data._M_elems._24_5_ = 0;
    local_188.data._M_elems[7]._1_3_ = 0;
    local_188.data._M_elems._32_5_ = 0;
    local_188.data._M_elems[9]._1_3_ = 0;
    local_188.exp = 0;
    local_188.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<50U,_int,_void> *)local_2d8,1,(type *)0x0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_188,(cpp_dec_float<50U,_int,_void> *)local_2d8,
               &pnVar35[(long)iVar19 + (long)iVar17 + -1].m_backend);
    pnVar35 = (local_298->diag).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)pnVar35[iVar13].m_backend.data._M_elems + 0x20) =
         CONCAT35(local_188.data._M_elems[9]._1_3_,local_188.data._M_elems._32_5_);
    puVar1 = (uint *)((long)pnVar35[iVar13].m_backend.data._M_elems + 0x10);
    *(undefined8 *)puVar1 = local_188.data._M_elems._16_8_;
    *(ulong *)(puVar1 + 2) =
         CONCAT35(local_188.data._M_elems[7]._1_3_,local_188.data._M_elems._24_5_);
    *(undefined8 *)pnVar35[iVar13].m_backend.data._M_elems = local_188.data._M_elems._0_8_;
    *(undefined8 *)((long)pnVar35[iVar13].m_backend.data._M_elems + 8) =
         local_188.data._M_elems._8_8_;
    pnVar35[iVar13].m_backend.exp = local_188.exp;
    pnVar35[iVar13].m_backend.neg = local_188.neg;
    pnVar35[iVar13].m_backend.fpclass = local_188.fpclass;
    pnVar35[iVar13].m_backend.prec_elem = local_188.prec_elem;
    iVar19 = local_228[local_270];
    local_228[local_270] = iVar19 + -1;
    lVar14 = (long)(iVar19 + -1 + local_220[local_270]);
    pfVar23 = &local_250[lVar14 + 1].m_backend.fpclass;
    piVar34 = local_258 + lVar14 + 1;
    do {
      pfVar18 = pfVar23;
      piVar26 = piVar34 + -1;
      piVar20 = piVar34 + -1;
      pfVar23 = pfVar18 + -0xe;
      piVar34 = piVar26;
    } while (*piVar20 != iVar13);
    *piVar26 = local_258[lVar14];
    *(undefined8 *)(pfVar18 + -0x12) =
         *(undefined8 *)((long)local_250[lVar14].m_backend.data._M_elems + 0x20);
    uVar4 = *(undefined8 *)local_250[lVar14].m_backend.data._M_elems;
    uVar6 = *(undefined8 *)((long)local_250[lVar14].m_backend.data._M_elems + 8);
    puVar1 = (uint *)((long)local_250[lVar14].m_backend.data._M_elems + 0x10);
    uVar7 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)(pfVar18 + -0x16) = *(undefined8 *)puVar1;
    *(undefined8 *)(pfVar18 + -0x14) = uVar7;
    *(undefined8 *)(pfVar18 + -0x1a) = uVar4;
    *(undefined8 *)(pfVar18 + -0x18) = uVar6;
    pfVar18[-0x10] = local_250[lVar14].m_backend.exp;
    *(bool *)(pfVar18 + -0xf) = local_250[lVar14].m_backend.neg;
    *(undefined8 *)(pfVar18 + -0xe) = *(undefined8 *)&local_250[lVar14].m_backend.fpclass;
  }
  else {
    local_248 = (int *)(long)iVar13;
    iVar17 = local_1a0[(long)local_248];
    local_230 = (long)local_248 + 1;
    local_1f8 = (int *)((long)(ulong)uVar16 * 4);
    piVar20 = local_1a0 + (long)local_248;
    local_288 = pnVar35;
    local_268 = (pointer)(ulong)uVar16;
    memmove(piVar20,local_1a0 + (long)local_248 + 1,(size_t)local_1f8);
    piVar26 = local_200;
    local_270 = (ulong)pfVar23 & 0xffffffff;
    piVar34[local_270] = iVar17;
    iVar19 = iVar19 + 1;
    local_260 = (fpclass_type *)CONCAT44(local_260._4_4_,iVar13);
    do {
      local_210[*piVar20] = iVar13;
      iVar13 = iVar13 + 1;
      piVar20 = piVar20 + 1;
    } while (iVar19 != iVar13);
    piVar34 = local_200 + (long)local_248;
    iVar13 = *piVar34;
    memmove(piVar34,local_200 + local_230,(size_t)local_1f8);
    piVar20 = local_228;
    pCVar38 = local_298;
    piVar26[local_270] = iVar13;
    iVar13 = (int)local_260;
    do {
      *(int *)((long)local_1a8 + (long)*piVar34 * 4) = iVar13;
      iVar13 = iVar13 + 1;
      piVar34 = piVar34 + 1;
    } while (iVar19 != iVar13);
    iVar13 = local_1a0[local_270];
    local_1f8 = (int *)CONCAT44(local_1f8._4_4_,iVar13);
    local_230 = (long)iVar13;
    iVar17 = local_218[local_230];
    uVar16 = local_208[local_230];
    local_298->nzCnt = local_298->nzCnt - uVar16;
    lVar14 = (long)iVar17 + -1 + (long)(int)uVar16;
    iVar28 = (int)lVar14;
    if ((double)(int)uVar16 < (double)((int)local_280 - (int)local_260) * 0.001) {
      local_248 = (int *)((ulong)local_248 & 0xffffffff00000000);
      uVar36 = 0;
      if (iVar17 <= iVar28) {
        local_280 = local_258 + 1;
        local_260 = &local_250[1].m_backend.fpclass;
        uVar25 = 0;
        do {
          iVar19 = local_278[lVar14];
          *(undefined8 *)(p_work[iVar19].m_backend.data._M_elems + 8) =
               *(undefined8 *)((long)local_288[lVar14].m_backend.data._M_elems + 0x20);
          uVar4 = *(undefined8 *)local_288[lVar14].m_backend.data._M_elems;
          uVar6 = *(undefined8 *)((long)local_288[lVar14].m_backend.data._M_elems + 8);
          puVar1 = (uint *)((long)local_288[lVar14].m_backend.data._M_elems + 0x10);
          uVar7 = *(undefined8 *)(puVar1 + 2);
          puVar2 = p_work[iVar19].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
          *(undefined8 *)(puVar2 + 2) = uVar7;
          *(undefined8 *)p_work[iVar19].m_backend.data._M_elems = uVar4;
          *(undefined8 *)(p_work[iVar19].m_backend.data._M_elems + 2) = uVar6;
          p_work[iVar19].m_backend.exp = local_288[lVar14].m_backend.exp;
          p_work[iVar19].m_backend.neg = local_288[lVar14].m_backend.neg;
          iVar9 = local_288[lVar14].m_backend.prec_elem;
          p_work[iVar19].m_backend.fpclass = local_288[lVar14].m_backend.fpclass;
          p_work[iVar19].m_backend.prec_elem = iVar9;
          uVar36 = *(uint *)((long)local_1a8 + (long)iVar19 * 4);
          uVar30 = uVar25;
          if (uVar25 == 0) {
            lVar31 = 0;
          }
          else {
            do {
              uVar33 = uVar30 - 1;
              uVar29 = uVar33 >> 1;
              if ((int)local_2e0[uVar29] <= (int)uVar36) break;
              local_2e0[uVar30] = local_2e0[uVar29];
              uVar30 = uVar29;
            } while (1 < uVar33);
            lVar31 = (long)(int)uVar30;
          }
          uVar25 = uVar25 + 1;
          local_2e0[lVar31] = uVar36;
          iVar17 = local_228[iVar19];
          local_228[iVar19] = iVar17 + -1;
          lVar31 = (long)(iVar17 + -1 + local_220[iVar19]);
          pfVar23 = local_260 + lVar31 * 0xe;
          piVar34 = local_280 + lVar31;
          do {
            pfVar18 = pfVar23;
            piVar32 = piVar34 + -1;
            piVar26 = piVar34 + -1;
            pfVar23 = pfVar18 + -0xe;
            piVar34 = piVar32;
          } while (*piVar26 != iVar13);
          *piVar32 = local_258[lVar31];
          *(undefined8 *)(pfVar18 + -0x12) =
               *(undefined8 *)((long)local_250[lVar31].m_backend.data._M_elems + 0x20);
          uVar4 = *(undefined8 *)local_250[lVar31].m_backend.data._M_elems;
          uVar6 = *(undefined8 *)((long)local_250[lVar31].m_backend.data._M_elems + 8);
          puVar1 = (uint *)((long)local_250[lVar31].m_backend.data._M_elems + 0x10);
          uVar7 = *(undefined8 *)(puVar1 + 2);
          *(undefined8 *)(pfVar18 + -0x16) = *(undefined8 *)puVar1;
          *(undefined8 *)(pfVar18 + -0x14) = uVar7;
          *(undefined8 *)(pfVar18 + -0x1a) = uVar4;
          *(undefined8 *)(pfVar18 + -0x18) = uVar6;
          pfVar18[-0x10] = local_250[lVar31].m_backend.exp;
          *(bool *)(pfVar18 + -0xf) = local_250[lVar31].m_backend.neg;
          *(undefined8 *)(pfVar18 + -0xe) = *(undefined8 *)&local_250[lVar31].m_backend.fpclass;
          lVar14 = lVar14 + -1;
          uVar36 = uVar16;
        } while (uVar25 != uVar16);
      }
      iVar19 = (int)lVar14;
      iVar13 = makeLvec(local_298,(int)local_268,iVar13);
      if (uVar36 != 0) {
        local_268 = (pCVar38->l).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_210 = (pCVar38->l).idx;
        piVar34 = (int *)(long)iVar13;
        do {
          piVar20 = local_208;
          uVar16 = *local_2e0;
          local_260 = (fpclass_type *)(ulong)uVar16;
          uVar25 = local_2e0[(long)(int)uVar36 + -1];
          iVar19 = 1;
          iVar13 = 0;
          if (3 < (int)uVar36) {
            iVar13 = 0;
            do {
              uVar30 = local_2e0[iVar19];
              uVar29 = local_2e0[(long)iVar19 + 1];
              if ((int)uVar30 < (int)uVar29) {
                iVar17 = iVar19;
                uVar29 = uVar30;
                if ((int)uVar25 <= (int)uVar30) goto LAB_002a6d62;
              }
              else {
                if ((int)uVar25 <= (int)uVar29) goto LAB_002a6d62;
                iVar17 = iVar19 + 1;
              }
              local_2e0[iVar13] = uVar29;
              iVar19 = iVar17 * 2 + 1;
              iVar13 = iVar17;
            } while (iVar19 < (int)(uVar36 - 2));
          }
          if ((iVar19 < (int)(uVar36 - 1)) && ((int)local_2e0[iVar19] < (int)uVar25)) {
            local_2e0[iVar13] = local_2e0[iVar19];
            iVar13 = iVar19;
          }
LAB_002a6d62:
          local_248 = (int *)CONCAT44(local_248._4_4_,uVar36 - 1);
          local_2e0[iVar13] = uVar25;
          pfVar23 = local_290;
          if (uVar16 == (uint)local_290) goto LAB_002a7eff;
          iVar13 = local_1a0[(int)uVar16];
          pcVar37 = &p_work[local_200[(int)uVar16]].m_backend;
          pcVar27 = &(pCVar38->diag).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend;
          local_2a8 = (int *)0xa00000000;
          local_2d8._0_16_ = ZEXT816(0);
          local_2d8._16_4_ = 0;
          local_2d8._20_4_ = 0;
          local_2d8._24_5_ = 0;
          local_2d8._29_3_ = 0;
          local_2d8._32_5_ = 0;
          local_2d8._37_3_ = 0;
          local_2d8._40_4_ = 0;
          local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
          pcVar22 = pcVar37;
          if (((cpp_dec_float<50U,_int,_void> *)local_2d8 != pcVar27) &&
             (pcVar22 = pcVar27, (cpp_dec_float<50U,_int,_void> *)local_2d8 != pcVar37)) {
            uVar4 = *(undefined8 *)((pcVar37->data)._M_elems + 8);
            local_2d8._32_5_ = (undefined5)uVar4;
            local_2d8._37_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_2d8._0_16_ = *(undefined1 (*) [16])(pcVar37->data)._M_elems;
            local_2d8._16_8_ = *(undefined8 *)((pcVar37->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar37->data)._M_elems + 6);
            local_2d8._24_5_ = (undefined5)uVar4;
            local_2d8._29_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_2d8._40_4_ = pcVar37->exp;
            local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)pcVar37->neg;
            local_2a8 = *(int **)&pcVar37->fpclass;
          }
          local_280 = piVar34;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_2d8,pcVar22);
          local_318._0_4_ = local_2d8._0_4_;
          local_318._4_4_ = local_2d8._4_4_;
          local_318._8_4_ = local_2d8._8_4_;
          local_318._12_4_ = local_2d8._12_4_;
          local_318._16_4_ = (undefined4)local_2d8._16_8_;
          local_318._20_4_ = SUB84(local_2d8._16_8_,4);
          local_318._24_4_ = (undefined4)local_2d8._24_5_;
          local_318._28_4_ = (undefined4)(CONCAT35(local_2d8._29_3_,local_2d8._24_5_) >> 0x20);
          local_318._32_4_ = (undefined4)local_2d8._32_5_;
          local_318._36_4_ = (undefined4)(CONCAT35(local_2d8._37_3_,local_2d8._32_5_) >> 0x20);
          local_318._40_4_ = local_2d8._40_4_;
          local_318[0x2c] = local_2d8[0x2c];
          local_2e8 = local_2a8;
          local_210[(long)local_280] = iVar13;
          *(ulong *)((long)local_268[(long)local_280].m_backend.data._M_elems + 0x20) =
               CONCAT44(local_318._36_4_,local_318._32_4_);
          puVar1 = (uint *)((long)local_268[(long)local_280].m_backend.data._M_elems + 0x10);
          *(undefined8 *)puVar1 = local_2d8._16_8_;
          *(ulong *)(puVar1 + 2) = CONCAT44(local_318._28_4_,local_318._24_4_);
          *(undefined8 *)local_268[(long)local_280].m_backend.data._M_elems = local_2d8._0_8_;
          *(undefined8 *)((long)local_268[(long)local_280].m_backend.data._M_elems + 8) =
               local_2d8._8_8_;
          local_268[(long)local_280].m_backend.exp = local_2d8._40_4_;
          local_268[(long)local_280].m_backend.neg = (bool)local_2d8[0x2c];
          *(int **)&local_268[(long)local_280].m_backend.fpclass = local_2a8;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)pcVar37,0.0);
          local_2d8._32_5_ = (undefined5)CONCAT44(local_318._36_4_,local_318._32_4_);
          local_2d8._37_3_ = SUB43(local_318._36_4_,1);
          local_2d8._4_4_ = local_318._4_4_;
          local_2d8._0_4_ = local_318._0_4_;
          local_2d8._12_4_ = local_318._12_4_;
          local_2d8._8_4_ = local_318._8_4_;
          local_2d8._20_4_ = local_318._20_4_;
          local_2d8._16_4_ = local_318._16_4_;
          local_2d8._24_5_ = (undefined5)CONCAT44(local_318._28_4_,local_318._24_4_);
          local_2d8._29_3_ = SUB43(local_318._28_4_,1);
          local_2d8._40_4_ = local_318._40_4_;
          local_2d8[0x2c] = local_318[0x2c];
          local_2a8 = local_2e8;
          if ((local_318[0x2c] == (cpp_dec_float<50u,int,void>)0x1) &&
             (local_318._0_4_ != 0 || (int)local_2e8 != 0)) {
            local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
          }
          if ((((int)local_2e8 != 2) && (local_1e8._48_4_ != cpp_dec_float_NaN)) &&
             (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_2d8,
                                  (cpp_dec_float<50U,_int,_void> *)local_1e8), 0 < iVar19)) {
            local_1e8[0x2c] = local_318[0x2c];
            if (local_318[0x2c] == (cpp_dec_float<50u,int,void>)0x1) {
              local_1e8[0x2c] =
                   (cpp_dec_float<50u,int,void>)((int)local_2e8 == 0 && local_318._0_4_ == 0);
            }
            local_1e8._0_4_ = local_318._0_4_;
            local_1e8._36_4_ = local_318._36_4_;
            local_1e8._20_4_ = local_318._20_4_;
            local_1e8._24_4_ = local_318._24_4_;
            local_1e8._28_4_ = local_318._28_4_;
            local_1e8._32_4_ = local_318._32_4_;
            local_1e8._4_4_ = local_318._4_4_;
            local_1e8._8_4_ = local_318._8_4_;
            local_1e8._12_4_ = local_318._12_4_;
            local_1e8._16_4_ = local_318._16_4_;
            local_1e8._40_4_ = local_318._40_4_;
            local_1e8._48_8_ = local_2e8;
          }
          if (0 < (long)piVar20[iVar13]) {
            lVar31 = (long)local_218[iVar13];
            lVar14 = piVar20[iVar13] + lVar31;
            do {
              iVar13 = local_278[lVar31];
              uVar4 = *(undefined8 *)(p_work[iVar13].m_backend.data._M_elems + 8);
              local_188.data._M_elems._32_5_ = SUB85(uVar4,0);
              local_188.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_188.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])p_work[iVar13].m_backend.data._M_elems;
              puVar1 = p_work[iVar13].m_backend.data._M_elems + 4;
              local_188.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              uVar4 = *(undefined8 *)(puVar1 + 2);
              local_188.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_188.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_188.exp = p_work[iVar13].m_backend.exp;
              local_188.neg = p_work[iVar13].m_backend.neg;
              local_188.fpclass = p_work[iVar13].m_backend.fpclass;
              local_188.prec_elem = p_work[iVar13].m_backend.prec_elem;
              if (local_188.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_2d8,0,(type *)0x0);
                iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_188,(cpp_dec_float<50U,_int,_void> *)local_2d8);
                if (iVar19 == 0) {
                  uVar16 = *(uint *)((long)local_1a8 + (long)iVar13 * 4);
                  uVar36 = (uint)local_248;
                  if (0 < (int)(uint)local_248) {
                    do {
                      uVar25 = uVar36 - 1;
                      uVar30 = uVar25 >> 1;
                      if ((int)local_2e0[uVar30] <= (int)uVar16) break;
                      local_2e0[uVar36] = local_2e0[uVar30];
                      uVar36 = uVar30;
                    } while (1 < uVar25);
                  }
                  local_248 = (int *)CONCAT44(local_248._4_4_,(uint)local_248 + 1);
                  local_2e0[(int)uVar36] = uVar16;
                }
              }
              local_2a8 = (int *)0xa00000000;
              local_2d8._0_4_ = 0;
              local_2d8._4_4_ = 0;
              local_2d8._8_4_ = 0;
              local_2d8._12_4_ = 0;
              local_2d8._16_4_ = 0;
              local_2d8._20_4_ = 0;
              local_2d8._24_5_ = 0;
              local_2d8._29_3_ = 0;
              local_2d8._32_5_ = 0;
              local_2d8._37_3_ = 0;
              local_2d8._40_4_ = 0;
              local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
              pcVar22 = (cpp_dec_float<50U,_int,_void> *)local_318;
              if ((cpp_dec_float<50U,_int,_void> *)local_2d8 != &local_288[lVar31].m_backend) {
                local_2d8._32_5_ = (undefined5)CONCAT44(local_318._36_4_,local_318._32_4_);
                local_2d8._37_3_ = SUB43(local_318._36_4_,1);
                local_2d8._4_4_ = local_318._4_4_;
                local_2d8._0_4_ = local_318._0_4_;
                local_2d8._12_4_ = local_318._12_4_;
                local_2d8._8_4_ = local_318._8_4_;
                local_2d8._20_4_ = local_318._20_4_;
                local_2d8._16_4_ = local_318._16_4_;
                local_2d8._24_5_ = (undefined5)CONCAT44(local_318._28_4_,local_318._24_4_);
                local_2d8._29_3_ = SUB43(local_318._28_4_,1);
                local_2d8._40_4_ = local_318._40_4_;
                local_2d8[0x2c] = local_318[0x2c];
                local_2a8 = local_2e8;
                pcVar22 = &local_288[lVar31].m_backend;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        ((cpp_dec_float<50U,_int,_void> *)local_2d8,pcVar22);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_188,(cpp_dec_float<50U,_int,_void> *)local_2d8);
              a = 0.0;
              if (local_188.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_2d8,0,(type *)0x0);
                iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_188,(cpp_dec_float<50U,_int,_void> *)local_2d8);
                a = 0.0;
                if (iVar19 == 0) {
                  a = 1e-100;
                }
              }
              pnVar24 = p_work + iVar13;
              local_148.fpclass = cpp_dec_float_finite;
              local_148.prec_elem = 10;
              local_148.data._M_elems[0] = 0;
              local_148.data._M_elems[1] = 0;
              local_148.data._M_elems[2] = 0;
              local_148.data._M_elems[3] = 0;
              local_148.data._M_elems[4] = 0;
              local_148.data._M_elems[5] = 0;
              local_148.data._M_elems._24_5_ = 0;
              local_148.data._M_elems[7]._1_3_ = 0;
              local_148.data._M_elems._32_5_ = 0;
              local_148.data._M_elems[9]._1_3_ = 0;
              local_148.exp = 0;
              local_148.neg = false;
              local_2a8 = (int *)0xa00000000;
              local_2d8._0_16_ = ZEXT816(0);
              local_2d8._16_4_ = 0;
              local_2d8._20_4_ = 0;
              local_2d8._24_5_ = 0;
              local_2d8._29_3_ = 0;
              local_2d8._32_5_ = 0;
              local_2d8._37_3_ = 0;
              local_2d8._40_4_ = 0;
              local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_2d8,a);
              auVar12 = (undefined1  [16])local_188.data._M_elems._0_16_;
              local_148.data._M_elems[0] = local_188.data._M_elems[0];
              local_148.data._M_elems[1] = local_188.data._M_elems[1];
              local_148.data._M_elems[2] = local_188.data._M_elems[2];
              local_148.data._M_elems[3] = local_188.data._M_elems[3];
              local_148.data._M_elems[4] = local_188.data._M_elems[4];
              local_148.data._M_elems[5] = local_188.data._M_elems[5];
              local_148.data._M_elems._24_5_ = local_188.data._M_elems._24_5_;
              local_148.data._M_elems[7]._1_3_ = local_188.data._M_elems[7]._1_3_;
              local_148.data._M_elems._32_5_ = local_188.data._M_elems._32_5_;
              local_148.data._M_elems[9]._1_3_ = local_188.data._M_elems[9]._1_3_;
              local_148.exp = local_188.exp;
              local_148.neg = local_188.neg;
              local_148.fpclass = local_188.fpclass;
              local_148.prec_elem = local_188.prec_elem;
              local_188.data._M_elems._0_16_ = auVar12;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_148,(cpp_dec_float<50U,_int,_void> *)local_2d8);
              *(ulong *)((pnVar24->m_backend).data._M_elems + 8) =
                   CONCAT35(local_148.data._M_elems[9]._1_3_,local_148.data._M_elems._32_5_);
              *(undefined8 *)((pnVar24->m_backend).data._M_elems + 4) =
                   local_148.data._M_elems._16_8_;
              *(ulong *)((pnVar24->m_backend).data._M_elems + 6) =
                   CONCAT35(local_148.data._M_elems[7]._1_3_,local_148.data._M_elems._24_5_);
              *(undefined8 *)(pnVar24->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
              *(undefined8 *)((pnVar24->m_backend).data._M_elems + 2) =
                   local_148.data._M_elems._8_8_;
              (pnVar24->m_backend).exp = local_148.exp;
              (pnVar24->m_backend).neg = local_148.neg;
              (pnVar24->m_backend).fpclass = local_148.fpclass;
              (pnVar24->m_backend).prec_elem = local_148.prec_elem;
              lVar31 = lVar31 + 1;
            } while (lVar31 < lVar14);
          }
          piVar34 = (int *)((long)local_280 + 1);
          pCVar38 = local_298;
          uVar36 = (uint)local_248;
        } while ((uint)local_248 != 0);
        local_248 = (int *)((ulong)local_248 & 0xffffffff00000000);
        pfVar23 = local_260;
LAB_002a7eff:
        iVar19 = (int)pfVar23;
        iVar13 = (int)piVar34;
        piVar20 = local_228;
      }
      iVar17 = (pCVar38->l).firstUnused;
      if (local_190[(long)iVar17 + -1] == iVar13) {
        (pCVar38->l).firstUnused = iVar17 + -1;
      }
      else {
        local_190[iVar17] = iVar13;
      }
      if (iVar19 != (int)local_290) {
        local_298->stat = SINGULAR;
        puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2d8,"XFORE01 The loaded matrix is singular","");
        *puVar15 = &PTR__SPxException_003adbd8;
        puVar15[1] = puVar15 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar15 + 1),local_2d8._0_8_,
                   (undefined1 *)(local_2d8._0_8_ + local_2d8._8_8_));
        *puVar15 = &PTR__SPxException_003aea68;
        __cxa_throw(puVar15,&SPxStatusException::typeinfo,SPxException::~SPxException);
      }
      iVar13 = local_200[local_270];
      uVar4 = *(undefined8 *)(p_work[iVar13].m_backend.data._M_elems + 8);
      local_318._32_4_ = (undefined4)uVar4;
      local_318._36_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      uVar4 = *(undefined8 *)p_work[iVar13].m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(p_work[iVar13].m_backend.data._M_elems + 2);
      puVar1 = p_work[iVar13].m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar1;
      uVar8 = *(undefined8 *)(puVar1 + 2);
      local_318._16_4_ = (undefined4)uVar7;
      local_318._20_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_318._24_4_ = (undefined4)uVar8;
      local_318._28_4_ = (undefined4)((ulong)uVar8 >> 0x20);
      local_318._0_4_ = (undefined4)uVar4;
      local_318._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      local_318._8_4_ = (undefined4)uVar6;
      local_318._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
      local_318._40_4_ = p_work[iVar13].m_backend.exp;
      local_318[0x2c] = (cpp_dec_float<50u,int,void>)p_work[iVar13].m_backend.neg;
      local_2e8._0_4_ = p_work[iVar13].m_backend.fpclass;
      local_2e8._4_4_ = p_work[iVar13].m_backend.prec_elem;
      local_188.fpclass = cpp_dec_float_finite;
      local_188.prec_elem = 10;
      local_188.data._M_elems._0_16_ = ZEXT816(0);
      local_188.data._M_elems[4] = 0;
      local_188.data._M_elems[5] = 0;
      local_188.data._M_elems._24_5_ = 0;
      local_188.data._M_elems[7]._1_3_ = 0;
      local_188.data._M_elems._32_5_ = 0;
      local_188.data._M_elems[9]._1_3_ = 0;
      local_188.exp = 0;
      local_188.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<50U,_int,_void> *)local_2d8,1,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_188,(cpp_dec_float<50U,_int,_void> *)local_2d8,
                 (cpp_dec_float<50U,_int,_void> *)local_318);
      lVar14 = local_230;
      pCVar38 = local_298;
      pnVar35 = (local_298->diag).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)pnVar35[local_230].m_backend.data._M_elems + 0x20) =
           CONCAT35(local_188.data._M_elems[9]._1_3_,local_188.data._M_elems._32_5_);
      puVar1 = (uint *)((long)pnVar35[local_230].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar1 = local_188.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_188.data._M_elems[7]._1_3_,local_188.data._M_elems._24_5_);
      *(undefined8 *)pnVar35[local_230].m_backend.data._M_elems = local_188.data._M_elems._0_8_;
      *(undefined8 *)((long)pnVar35[local_230].m_backend.data._M_elems + 8) =
           local_188.data._M_elems._8_8_;
      pnVar35[local_230].m_backend.exp = local_188.exp;
      pnVar35[local_230].m_backend.neg = local_188.neg;
      pnVar35[local_230].m_backend.fpclass = local_188.fpclass;
      pnVar35[local_230].m_backend.prec_elem = local_188.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)(p_work + iVar13),0.0);
      piVar34 = local_248;
      iVar13 = (uint)local_248;
      if (local_198[lVar14] < (int)(uint)local_248) {
        local_208[lVar14] = 0;
        remaxRow(pCVar38,(int)local_1f8,(uint)local_248);
        local_288 = (pCVar38->u).row.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_278 = (pCVar38->u).row.idx;
        lVar14 = local_230;
      }
      pCVar38->nzCnt = pCVar38->nzCnt + iVar13;
      iVar19 = local_218[lVar14];
      iVar17 = iVar19;
      if (0 < iVar13) {
        local_290 = (fpclass_type *)CONCAT44(local_290._4_4_,iVar19);
        local_248 = (int *)((ulong)piVar34 & 0xffffffff);
        uVar21 = 0;
        do {
          iVar13 = local_200[(int)local_2e0[uVar21]];
          uVar4 = *(undefined8 *)(p_work[iVar13].m_backend.data._M_elems + 8);
          local_318._32_4_ = (undefined4)uVar4;
          local_318._36_4_ = (undefined4)((ulong)uVar4 >> 0x20);
          uVar4 = *(undefined8 *)p_work[iVar13].m_backend.data._M_elems;
          uVar6 = *(undefined8 *)(p_work[iVar13].m_backend.data._M_elems + 2);
          puVar1 = p_work[iVar13].m_backend.data._M_elems + 4;
          uVar7 = *(undefined8 *)puVar1;
          uVar8 = *(undefined8 *)(puVar1 + 2);
          local_318._16_4_ = (undefined4)uVar7;
          local_318._20_4_ = (undefined4)((ulong)uVar7 >> 0x20);
          local_318._24_4_ = (undefined4)uVar8;
          local_318._28_4_ = (undefined4)((ulong)uVar8 >> 0x20);
          local_318._0_4_ = (undefined4)uVar4;
          local_318._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
          local_318._8_4_ = (undefined4)uVar6;
          local_318._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
          local_318._40_4_ = p_work[iVar13].m_backend.exp;
          local_318[0x2c] = (cpp_dec_float<50u,int,void>)p_work[iVar13].m_backend.neg;
          fVar3 = p_work[iVar13].m_backend.fpclass;
          local_2a8._4_4_ = p_work[iVar13].m_backend.prec_elem;
          local_2e8 = (int *)CONCAT44(local_2a8._4_4_,fVar3);
          local_2a8._0_4_ = cpp_dec_float_NaN;
          if (fVar3 == cpp_dec_float_NaN) {
LAB_002a817a:
            local_2d8._32_5_ = (undefined5)CONCAT44(local_318._36_4_,local_318._32_4_);
            local_2d8._37_3_ = SUB43(local_318._36_4_,1);
            local_2d8._4_4_ = local_318._4_4_;
            local_2d8._0_4_ = local_318._0_4_;
            local_2d8._12_4_ = local_318._12_4_;
            local_2d8._8_4_ = local_318._8_4_;
            local_2d8._20_4_ = local_318._20_4_;
            local_2d8._16_4_ = local_318._16_4_;
            local_2d8._24_5_ = (undefined5)CONCAT44(local_318._28_4_,local_318._24_4_);
            local_2d8._29_3_ = SUB43(local_318._28_4_,1);
            local_2d8[0x2c] = local_318[0x2c];
            if ((((byte)local_318[0x2c] & 1) != 0) &&
               (local_318._0_4_ != 0 || (fpclass_type)local_2a8 != cpp_dec_float_finite)) {
              local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)((byte)local_318[0x2c] ^ 1);
            }
            local_2d8._40_4_ = local_318._40_4_;
            if (((fpclass_type)local_2a8 == cpp_dec_float_NaN) ||
               (local_1e8._48_4_ == cpp_dec_float_NaN)) {
            }
            else {
              iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_2d8,
                                  (cpp_dec_float<50U,_int,_void> *)local_1e8);
              if (0 < iVar19) {
                local_1e8[0x2c] = local_318[0x2c];
                if (local_318[0x2c] == (cpp_dec_float<50u,int,void>)0x1) {
                  local_1e8[0x2c] =
                       (cpp_dec_float<50u,int,void>)((int)local_2e8 == 0 && local_318._0_4_ == 0);
                }
                local_1e8._0_4_ = local_318._0_4_;
                local_1e8._36_4_ = local_318._36_4_;
                local_1e8._20_4_ = local_318._20_4_;
                local_1e8._24_4_ = local_318._24_4_;
                local_1e8._28_4_ = local_318._28_4_;
                local_1e8._32_4_ = local_318._32_4_;
                local_1e8._4_4_ = local_318._4_4_;
                local_1e8._8_4_ = local_318._8_4_;
                local_1e8._12_4_ = local_318._12_4_;
                local_1e8._16_4_ = local_318._16_4_;
                local_1e8._40_4_ = local_318._40_4_;
                local_1e8._48_8_ = local_2e8;
              }
            }
            local_278[(int)local_290] = iVar13;
            *(ulong *)((long)local_288[(int)local_290].m_backend.data._M_elems + 0x20) =
                 CONCAT44(local_318._36_4_,local_318._32_4_);
            puVar1 = (uint *)((long)local_288[(int)local_290].m_backend.data._M_elems + 0x10);
            *(ulong *)puVar1 = CONCAT44(local_318._20_4_,local_318._16_4_);
            *(ulong *)(puVar1 + 2) = CONCAT44(local_318._28_4_,local_318._24_4_);
            *(ulong *)local_288[(int)local_290].m_backend.data._M_elems =
                 CONCAT44(local_318._4_4_,local_318._0_4_);
            *(ulong *)((long)local_288[(int)local_290].m_backend.data._M_elems + 8) =
                 CONCAT44(local_318._12_4_,local_318._8_4_);
            local_288[(int)local_290].m_backend.exp = local_318._40_4_;
            local_288[(int)local_290].m_backend.neg = (bool)local_318[0x2c];
            *(int **)&local_288[(int)local_290].m_backend.fpclass = local_2e8;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)(p_work + iVar13),0.0);
            pCVar38 = local_298;
            iVar19 = piVar20[iVar13];
            if (local_1b0[iVar13] <= iVar19) {
              forestReMaxCol(local_298,iVar13,iVar19 + 1);
              local_258 = (pCVar38->u).col.idx;
              local_250 = (pCVar38->u).col.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              iVar19 = piVar20[iVar13];
            }
            local_290 = (fpclass_type *)CONCAT44(local_290._4_4_,(int)local_290 + 1);
            lVar14 = (long)iVar19 + (long)local_220[iVar13];
            *(ulong *)((long)local_250[lVar14].m_backend.data._M_elems + 0x20) =
                 CONCAT44(local_318._36_4_,local_318._32_4_);
            puVar1 = (uint *)((long)local_250[lVar14].m_backend.data._M_elems + 0x10);
            *(ulong *)puVar1 = CONCAT44(local_318._20_4_,local_318._16_4_);
            *(ulong *)(puVar1 + 2) = CONCAT44(local_318._28_4_,local_318._24_4_);
            *(ulong *)local_250[lVar14].m_backend.data._M_elems =
                 CONCAT44(local_318._4_4_,local_318._0_4_);
            *(ulong *)((long)local_250[lVar14].m_backend.data._M_elems + 8) =
                 CONCAT44(local_318._12_4_,local_318._8_4_);
            local_250[lVar14].m_backend.exp = local_318._40_4_;
            local_250[lVar14].m_backend.neg = (bool)local_318[0x2c];
            *(int **)&local_250[lVar14].m_backend.fpclass = local_2e8;
            iVar19 = local_220[iVar13];
            iVar17 = piVar20[iVar13];
            piVar20[iVar13] = iVar17 + 1;
            local_258[(long)iVar19 + (long)iVar17] = (int)local_1f8;
          }
          else {
            local_2a8._0_4_ = cpp_dec_float_finite;
            local_2a8._4_4_ = 10;
            local_2d8._0_16_ = ZEXT816(0);
            local_2d8._16_4_ = 0;
            local_2d8._20_4_ = 0;
            local_2d8._24_5_ = 0;
            local_2d8._29_3_ = 0;
            local_2d8._32_5_ = 0;
            local_2d8._37_3_ = 0;
            local_2d8._40_4_ = 0;
            local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2d8,0.0);
            iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_318,
                                (cpp_dec_float<50U,_int,_void> *)local_2d8);
            pCVar38 = local_298;
            if (iVar19 != 0) {
              local_2a8._4_4_ = local_2e8._4_4_;
              local_2a8._0_4_ = (fpclass_type)local_2e8;
              goto LAB_002a817a;
            }
          }
          uVar21 = uVar21 + 1;
        } while (local_248 != (int *)uVar21);
        lVar14 = local_230;
        iVar19 = (int)local_290;
        iVar17 = local_218[local_230];
      }
      local_208[lVar14] = iVar19 - iVar17;
      local_298 = pCVar38;
    }
    else {
      local_210 = (int *)CONCAT44(local_210._4_4_,iVar19);
      if (iVar17 <= iVar28) {
        lVar14 = (long)iVar28;
        do {
          iVar19 = local_278[lVar14];
          *(undefined8 *)(p_work[iVar19].m_backend.data._M_elems + 8) =
               *(undefined8 *)((long)local_288[lVar14].m_backend.data._M_elems + 0x20);
          uVar4 = *(undefined8 *)local_288[lVar14].m_backend.data._M_elems;
          uVar6 = *(undefined8 *)((long)local_288[lVar14].m_backend.data._M_elems + 8);
          puVar1 = (uint *)((long)local_288[lVar14].m_backend.data._M_elems + 0x10);
          uVar7 = *(undefined8 *)(puVar1 + 2);
          puVar2 = p_work[iVar19].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
          *(undefined8 *)(puVar2 + 2) = uVar7;
          *(undefined8 *)p_work[iVar19].m_backend.data._M_elems = uVar4;
          *(undefined8 *)(p_work[iVar19].m_backend.data._M_elems + 2) = uVar6;
          p_work[iVar19].m_backend.exp = local_288[lVar14].m_backend.exp;
          p_work[iVar19].m_backend.neg = local_288[lVar14].m_backend.neg;
          iVar9 = local_288[lVar14].m_backend.prec_elem;
          p_work[iVar19].m_backend.fpclass = local_288[lVar14].m_backend.fpclass;
          p_work[iVar19].m_backend.prec_elem = iVar9;
          iVar28 = local_228[iVar19];
          local_228[iVar19] = iVar28 + -1;
          lVar31 = (long)(iVar28 + -1 + local_220[iVar19]);
          pfVar23 = &local_250[lVar31 + 1].m_backend.fpclass;
          piVar34 = local_258 + lVar31 + 1;
          do {
            pfVar18 = pfVar23;
            piVar26 = piVar34 + -1;
            piVar20 = piVar34 + -1;
            pfVar23 = pfVar18 + -0xe;
            piVar34 = piVar26;
          } while (*piVar20 != iVar13);
          *piVar26 = local_258[lVar31];
          *(undefined8 *)(pfVar18 + -0x12) =
               *(undefined8 *)((long)local_250[lVar31].m_backend.data._M_elems + 0x20);
          uVar4 = *(undefined8 *)local_250[lVar31].m_backend.data._M_elems;
          uVar6 = *(undefined8 *)((long)local_250[lVar31].m_backend.data._M_elems + 8);
          puVar1 = (uint *)((long)local_250[lVar31].m_backend.data._M_elems + 0x10);
          uVar7 = *(undefined8 *)(puVar1 + 2);
          *(undefined8 *)(pfVar18 + -0x16) = *(undefined8 *)puVar1;
          *(undefined8 *)(pfVar18 + -0x14) = uVar7;
          *(undefined8 *)(pfVar18 + -0x1a) = uVar4;
          *(undefined8 *)(pfVar18 + -0x18) = uVar6;
          pfVar18[-0x10] = local_250[lVar31].m_backend.exp;
          *(bool *)(pfVar18 + -0xf) = local_250[lVar31].m_backend.neg;
          *(undefined8 *)(pfVar18 + -0xe) = *(undefined8 *)&local_250[lVar31].m_backend.fpclass;
          bVar5 = iVar17 < lVar14;
          lVar14 = lVar14 + -1;
        } while (bVar5);
      }
      iVar13 = makeLvec(local_298,(int)local_268,iVar13);
      local_2e0 = (uint *)CONCAT44(local_2e0._4_4_,iVar13);
      local_1a8 = (pCVar38->l).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_260 = (fpclass_type *)(pCVar38->l).idx;
      pfVar23 = local_290;
      piVar34 = local_248;
      do {
        pcVar22 = &p_work[local_200[(long)piVar34]].m_backend;
        if (p_work[local_200[(long)piVar34]].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002a7634:
          iVar13 = local_1a0[(long)piVar34];
          pcVar37 = &(local_298->diag).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend;
          local_2a8 = (int *)0xa00000000;
          local_2d8._0_16_ = ZEXT816(0);
          local_2d8._16_4_ = 0;
          local_2d8._20_4_ = 0;
          local_2d8._24_5_ = 0;
          local_2d8._29_3_ = 0;
          local_2d8._32_5_ = 0;
          local_2d8._37_3_ = 0;
          local_2d8._40_4_ = 0;
          local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
          pcVar27 = pcVar22;
          if (((cpp_dec_float<50U,_int,_void> *)local_2d8 != pcVar37) &&
             (pcVar27 = pcVar37, (cpp_dec_float<50U,_int,_void> *)local_2d8 != pcVar22)) {
            uVar4 = *(undefined8 *)((pcVar22->data)._M_elems + 8);
            local_2d8._32_5_ = (undefined5)uVar4;
            local_2d8._37_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_2d8._0_16_ = *(undefined1 (*) [16])(pcVar22->data)._M_elems;
            local_2d8._16_8_ = *(undefined8 *)((pcVar22->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar22->data)._M_elems + 6);
            local_2d8._24_5_ = (undefined5)uVar4;
            local_2d8._29_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_2d8._40_4_ = pcVar22->exp;
            local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)pcVar22->neg;
            local_2a8 = *(int **)&pcVar22->fpclass;
          }
          local_248 = piVar34;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_2d8,pcVar27);
          local_318._0_4_ = local_2d8._0_4_;
          local_318._4_4_ = local_2d8._4_4_;
          local_318._8_4_ = local_2d8._8_4_;
          local_318._12_4_ = local_2d8._12_4_;
          local_318._16_4_ = (undefined4)local_2d8._16_8_;
          local_318._20_4_ = SUB84(local_2d8._16_8_,4);
          local_318._24_4_ = (undefined4)local_2d8._24_5_;
          local_318._28_4_ = (undefined4)(CONCAT35(local_2d8._29_3_,local_2d8._24_5_) >> 0x20);
          local_318._32_4_ = (undefined4)local_2d8._32_5_;
          local_318._36_4_ = (undefined4)(CONCAT35(local_2d8._37_3_,local_2d8._32_5_) >> 0x20);
          local_318._40_4_ = local_2d8._40_4_;
          local_318[0x2c] = local_2d8[0x2c];
          local_2e8 = local_2a8;
          lVar14 = (long)(int)local_2e0;
          local_260[lVar14] = iVar13;
          *(ulong *)((long)local_1a8[lVar14].m_backend.data._M_elems + 0x20) =
               CONCAT44(local_318._36_4_,local_318._32_4_);
          puVar1 = (uint *)((long)local_1a8[lVar14].m_backend.data._M_elems + 0x10);
          *(undefined8 *)puVar1 = local_2d8._16_8_;
          *(ulong *)(puVar1 + 2) = CONCAT44(local_318._28_4_,local_318._24_4_);
          *(undefined8 *)local_1a8[lVar14].m_backend.data._M_elems = local_2d8._0_8_;
          *(undefined8 *)((long)local_1a8[lVar14].m_backend.data._M_elems + 8) = local_2d8._8_8_;
          local_1a8[lVar14].m_backend.exp = local_2d8._40_4_;
          local_1a8[lVar14].m_backend.neg = (bool)local_2d8[0x2c];
          *(int **)&local_1a8[lVar14].m_backend.fpclass = local_2a8;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)pcVar22,0.0);
          piVar20 = local_208;
          local_2d8._32_5_ = (undefined5)CONCAT44(local_318._36_4_,local_318._32_4_);
          local_2d8._37_3_ = SUB43(local_318._36_4_,1);
          local_2d8._4_4_ = local_318._4_4_;
          local_2d8._0_4_ = local_318._0_4_;
          local_2d8._12_4_ = local_318._12_4_;
          local_2d8._8_4_ = local_318._8_4_;
          local_2d8._20_4_ = local_318._20_4_;
          local_2d8._16_4_ = local_318._16_4_;
          local_2d8._24_5_ = (undefined5)CONCAT44(local_318._28_4_,local_318._24_4_);
          local_2d8._29_3_ = SUB43(local_318._28_4_,1);
          local_2d8._40_4_ = local_318._40_4_;
          local_2d8[0x2c] = local_318[0x2c];
          local_2a8 = local_2e8;
          if ((local_318[0x2c] == (cpp_dec_float<50u,int,void>)0x1) &&
             (local_318._0_4_ != 0 || (int)local_2e8 != 0)) {
            local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
          }
          if ((((int)local_2e8 != 2) && (local_1e8._48_4_ != cpp_dec_float_NaN)) &&
             (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_2d8,
                                  (cpp_dec_float<50U,_int,_void> *)local_1e8), 0 < iVar19)) {
            local_1e8[0x2c] = local_318[0x2c];
            if (local_318[0x2c] == (cpp_dec_float<50u,int,void>)0x1) {
              local_1e8[0x2c] =
                   (cpp_dec_float<50u,int,void>)((int)local_2e8 == 0 && local_318._0_4_ == 0);
            }
            local_1e8._0_4_ = local_318._0_4_;
            local_1e8._36_4_ = local_318._36_4_;
            local_1e8._20_4_ = local_318._20_4_;
            local_1e8._24_4_ = local_318._24_4_;
            local_1e8._28_4_ = local_318._28_4_;
            local_1e8._32_4_ = local_318._32_4_;
            local_1e8._4_4_ = local_318._4_4_;
            local_1e8._8_4_ = local_318._8_4_;
            local_1e8._12_4_ = local_318._12_4_;
            local_1e8._16_4_ = local_318._16_4_;
            local_1e8._40_4_ = local_318._40_4_;
            local_1e8._48_8_ = local_2e8;
          }
          local_2e0 = (uint *)CONCAT44(local_2e0._4_4_,(int)local_2e0 + 1);
          pfVar23 = local_290;
          piVar34 = local_248;
          if (0 < (long)piVar20[iVar13]) {
            lVar14 = (long)local_218[iVar13];
            lVar31 = piVar20[iVar13] + lVar14;
            pcVar22 = &local_288[lVar14].m_backend;
            do {
              local_2a8 = (int *)0xa00000000;
              local_2d8._0_16_ = (undefined1  [16])0x0;
              local_2d8._16_4_ = 0;
              local_2d8._20_4_ = 0;
              local_2d8._24_5_ = 0;
              local_2d8._29_3_ = 0;
              local_2d8._32_5_ = 0;
              local_2d8._37_3_ = 0;
              local_2d8._40_4_ = 0;
              local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
              pcVar27 = (cpp_dec_float<50U,_int,_void> *)local_318;
              if (pcVar22 != (cpp_dec_float<50U,_int,_void> *)local_2d8) {
                local_2d8._32_5_ = (undefined5)CONCAT44(local_318._36_4_,local_318._32_4_);
                local_2d8._37_3_ = SUB43(local_318._36_4_,1);
                local_2d8._4_4_ = local_318._4_4_;
                local_2d8._0_4_ = local_318._0_4_;
                local_2d8._12_4_ = local_318._12_4_;
                local_2d8._8_4_ = local_318._8_4_;
                local_2d8._20_4_ = local_318._20_4_;
                local_2d8._16_4_ = local_318._16_4_;
                local_2d8._24_5_ = (undefined5)CONCAT44(local_318._28_4_,local_318._24_4_);
                local_2d8._29_3_ = SUB43(local_318._28_4_,1);
                local_2d8._40_4_ = local_318._40_4_;
                local_2d8[0x2c] = local_318[0x2c];
                local_2a8 = local_2e8;
                pcVar27 = pcVar22;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        ((cpp_dec_float<50U,_int,_void> *)local_2d8,pcVar27);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&p_work[local_278[lVar14]].m_backend,
                         (cpp_dec_float<50U,_int,_void> *)local_2d8);
              lVar14 = lVar14 + 1;
              pcVar22 = pcVar22 + 1;
              pfVar23 = local_290;
              piVar34 = local_248;
            } while (lVar14 < lVar31);
          }
        }
        else {
          local_2a8 = (int *)0xa00000000;
          local_2d8._0_16_ = ZEXT816(0);
          local_2d8._16_4_ = 0;
          local_2d8._20_4_ = 0;
          local_2d8._24_5_ = 0;
          local_2d8._29_3_ = 0;
          local_2d8._32_5_ = 0;
          local_2d8._37_3_ = 0;
          local_2d8._40_4_ = 0;
          local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_2d8,0.0);
          iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar22,(cpp_dec_float<50U,_int,_void> *)local_2d8);
          if (iVar13 != 0) goto LAB_002a7634;
        }
        piVar20 = local_210;
        piVar34 = (int *)((long)piVar34 + 1);
      } while ((int)pfVar23 != (int)piVar34);
      iVar13 = (local_298->l).firstUnused;
      iVar19 = (int)local_210;
      if (local_190[(long)iVar13 + -1] == (int)local_2e0) {
        (local_298->l).firstUnused = iVar13 + -1;
      }
      else {
        local_190[iVar13] = (int)local_2e0;
      }
      iVar13 = local_200[local_270];
      uVar4 = *(undefined8 *)(p_work[iVar13].m_backend.data._M_elems + 8);
      local_318._32_4_ = (undefined4)uVar4;
      local_318._36_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      uVar4 = *(undefined8 *)p_work[iVar13].m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(p_work[iVar13].m_backend.data._M_elems + 2);
      puVar1 = p_work[iVar13].m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar1;
      uVar8 = *(undefined8 *)(puVar1 + 2);
      local_318._16_4_ = (undefined4)uVar7;
      local_318._20_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_318._24_4_ = (undefined4)uVar8;
      local_318._28_4_ = (undefined4)((ulong)uVar8 >> 0x20);
      local_318._0_4_ = (undefined4)uVar4;
      local_318._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      local_318._8_4_ = (undefined4)uVar6;
      local_318._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
      local_318._40_4_ = p_work[iVar13].m_backend.exp;
      local_318[0x2c] = (cpp_dec_float<50u,int,void>)p_work[iVar13].m_backend.neg;
      local_2e8._0_4_ = p_work[iVar13].m_backend.fpclass;
      local_2e8._4_4_ = p_work[iVar13].m_backend.prec_elem;
      if ((fpclass_type)local_2e8 != cpp_dec_float_NaN) {
        local_2a8 = (int *)0xa00000000;
        local_2d8._0_16_ = ZEXT816(0);
        local_2d8._16_4_ = 0;
        local_2d8._20_4_ = 0;
        local_2d8._24_5_ = 0;
        local_2d8._29_3_ = 0;
        local_2d8._32_5_ = 0;
        local_2d8._37_3_ = 0;
        local_2d8._40_4_ = 0;
        local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_2d8,0.0);
        iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_318,
                            (cpp_dec_float<50U,_int,_void> *)local_2d8);
        if (iVar17 == 0) {
          local_298->stat = SINGULAR;
          puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_2d8._0_8_ = local_2d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2d8,"XFORE02 The loaded matrix is singular","");
          *puVar15 = &PTR__SPxException_003adbd8;
          puVar15[1] = puVar15 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar15 + 1),local_2d8._0_8_,
                     (undefined1 *)(local_2d8._0_8_ + local_2d8._8_8_));
          *puVar15 = &PTR__SPxException_003aea68;
          __cxa_throw(puVar15,&SPxStatusException::typeinfo,SPxException::~SPxException);
        }
      }
      local_188.fpclass = cpp_dec_float_finite;
      local_188.prec_elem = 10;
      local_188.data._M_elems._0_16_ = ZEXT816(0);
      local_188.data._M_elems[4] = 0;
      local_188.data._M_elems[5] = 0;
      local_188.data._M_elems._24_5_ = 0;
      local_188.data._M_elems[7]._1_3_ = 0;
      local_188.data._M_elems._32_5_ = 0;
      local_188.data._M_elems[9]._1_3_ = 0;
      local_188.exp = 0;
      local_188.neg = false;
      iVar17 = 0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<50U,_int,_void> *)local_2d8,1,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_188,(cpp_dec_float<50U,_int,_void> *)local_2d8,
                 (cpp_dec_float<50U,_int,_void> *)local_318);
      pnVar35 = (local_298->diag).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)pnVar35[local_230].m_backend.data._M_elems + 0x20) =
           CONCAT35(local_188.data._M_elems[9]._1_3_,local_188.data._M_elems._32_5_);
      puVar1 = (uint *)((long)pnVar35[local_230].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar1 = local_188.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_188.data._M_elems[7]._1_3_,local_188.data._M_elems._24_5_);
      *(undefined8 *)pnVar35[local_230].m_backend.data._M_elems = local_188.data._M_elems._0_8_;
      *(undefined8 *)((long)pnVar35[local_230].m_backend.data._M_elems + 8) =
           local_188.data._M_elems._8_8_;
      pnVar35[local_230].m_backend.exp = local_188.exp;
      pnVar35[local_230].m_backend.neg = local_188.neg;
      pnVar35[local_230].m_backend.fpclass = local_188.fpclass;
      pnVar35[local_230].m_backend.prec_elem = local_188.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)(p_work + iVar13),0.0);
      local_248 = (int *)((ulong)piVar20 & 0xffffffff);
      if (iVar19 < (int)local_280) {
        piVar34 = local_200 + (long)local_248;
        iVar17 = 0;
        piVar20 = local_280;
        iVar13 = (int)local_210;
        do {
          iVar19 = *piVar34;
          uVar16 = 1;
          if (p_work[iVar19].m_backend.fpclass != cpp_dec_float_NaN) {
            local_2a8 = (int *)0xa00000000;
            local_2d8._0_16_ = ZEXT816(0);
            local_2d8._16_4_ = 0;
            local_2d8._20_4_ = 0;
            local_2d8._24_5_ = 0;
            local_2d8._29_3_ = 0;
            local_2d8._32_5_ = 0;
            local_2d8._37_3_ = 0;
            local_2d8._40_4_ = 0;
            local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2d8,0.0);
            iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&p_work[iVar19].m_backend,(cpp_dec_float<50U,_int,_void> *)local_2d8
                               );
            uVar16 = (uint)(iVar19 != 0);
            piVar20 = local_280;
          }
          iVar17 = iVar17 + uVar16;
          piVar34 = piVar34 + 1;
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)piVar20);
      }
      piVar34 = local_208;
      pCVar38 = local_298;
      if (local_198[local_230] < iVar17) {
        local_208[local_230] = 0;
        remaxRow(local_298,(int)local_1f8,iVar17);
        local_288 = (pCVar38->u).row.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_278 = (pCVar38->u).row.idx;
      }
      pCVar38->nzCnt = pCVar38->nzCnt + iVar17;
      iVar13 = local_218[local_230];
      iVar19 = iVar13;
      if ((int)local_210 < (int)local_280) {
        local_2e0 = (uint *)CONCAT44(local_2e0._4_4_,iVar13);
        piVar34 = local_200 + (long)local_248;
        iVar13 = (int)local_210;
        do {
          iVar19 = *piVar34;
          uVar4 = *(undefined8 *)(p_work[iVar19].m_backend.data._M_elems + 8);
          local_318._32_4_ = (undefined4)uVar4;
          local_318._36_4_ = (undefined4)((ulong)uVar4 >> 0x20);
          uVar4 = *(undefined8 *)p_work[iVar19].m_backend.data._M_elems;
          uVar6 = *(undefined8 *)(p_work[iVar19].m_backend.data._M_elems + 2);
          puVar1 = p_work[iVar19].m_backend.data._M_elems + 4;
          uVar7 = *(undefined8 *)puVar1;
          uVar8 = *(undefined8 *)(puVar1 + 2);
          local_318._16_4_ = (undefined4)uVar7;
          local_318._20_4_ = (undefined4)((ulong)uVar7 >> 0x20);
          local_318._24_4_ = (undefined4)uVar8;
          local_318._28_4_ = (undefined4)((ulong)uVar8 >> 0x20);
          local_318._0_4_ = (undefined4)uVar4;
          local_318._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
          local_318._8_4_ = (undefined4)uVar6;
          local_318._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
          local_318._40_4_ = p_work[iVar19].m_backend.exp;
          local_318[0x2c] = (cpp_dec_float<50u,int,void>)p_work[iVar19].m_backend.neg;
          fVar3 = p_work[iVar19].m_backend.fpclass;
          local_2a8._4_4_ = p_work[iVar19].m_backend.prec_elem;
          local_2e8 = (int *)CONCAT44(local_2a8._4_4_,fVar3);
          local_2a8._0_4_ = cpp_dec_float_NaN;
          if (fVar3 == cpp_dec_float_NaN) {
LAB_002a7ca2:
            local_2d8._32_5_ = (undefined5)CONCAT44(local_318._36_4_,local_318._32_4_);
            local_2d8._37_3_ = SUB43(local_318._36_4_,1);
            local_2d8._4_4_ = local_318._4_4_;
            local_2d8._0_4_ = local_318._0_4_;
            local_2d8._12_4_ = local_318._12_4_;
            local_2d8._8_4_ = local_318._8_4_;
            local_2d8._20_4_ = local_318._20_4_;
            local_2d8._16_4_ = local_318._16_4_;
            local_2d8._24_5_ = (undefined5)CONCAT44(local_318._28_4_,local_318._24_4_);
            local_2d8._29_3_ = SUB43(local_318._28_4_,1);
            local_2d8[0x2c] = local_318[0x2c];
            if ((((byte)local_318[0x2c] & 1) != 0) &&
               (local_318._0_4_ != 0 || (fpclass_type)local_2a8 != cpp_dec_float_finite)) {
              local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)((byte)local_318[0x2c] ^ 1);
            }
            local_2d8._40_4_ = local_318._40_4_;
            if ((((fpclass_type)local_2a8 != cpp_dec_float_NaN) &&
                (local_1e8._48_4_ != cpp_dec_float_NaN)) &&
               (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_2d8,
                                    (cpp_dec_float<50U,_int,_void> *)local_1e8), 0 < iVar17)) {
              local_1e8[0x2c] = local_318[0x2c];
              if (local_318[0x2c] == (cpp_dec_float<50u,int,void>)0x1) {
                local_1e8[0x2c] =
                     (cpp_dec_float<50u,int,void>)((int)local_2e8 == 0 && local_318._0_4_ == 0);
              }
              local_1e8._0_4_ = local_318._0_4_;
              local_1e8._36_4_ = local_318._36_4_;
              local_1e8._20_4_ = local_318._20_4_;
              local_1e8._24_4_ = local_318._24_4_;
              local_1e8._28_4_ = local_318._28_4_;
              local_1e8._32_4_ = local_318._32_4_;
              local_1e8._4_4_ = local_318._4_4_;
              local_1e8._8_4_ = local_318._8_4_;
              local_1e8._12_4_ = local_318._12_4_;
              local_1e8._16_4_ = local_318._16_4_;
              local_1e8._40_4_ = local_318._40_4_;
              local_1e8._48_8_ = local_2e8;
            }
            lVar14 = (long)(int)local_2e0;
            local_278[lVar14] = iVar19;
            *(ulong *)((long)local_288[lVar14].m_backend.data._M_elems + 0x20) =
                 CONCAT44(local_318._36_4_,local_318._32_4_);
            puVar1 = (uint *)((long)local_288[lVar14].m_backend.data._M_elems + 0x10);
            *(ulong *)puVar1 = CONCAT44(local_318._20_4_,local_318._16_4_);
            *(ulong *)(puVar1 + 2) = CONCAT44(local_318._28_4_,local_318._24_4_);
            *(ulong *)local_288[lVar14].m_backend.data._M_elems =
                 CONCAT44(local_318._4_4_,local_318._0_4_);
            *(ulong *)((long)local_288[lVar14].m_backend.data._M_elems + 8) =
                 CONCAT44(local_318._12_4_,local_318._8_4_);
            local_288[lVar14].m_backend.exp = local_318._40_4_;
            local_288[lVar14].m_backend.neg = (bool)local_318[0x2c];
            *(int **)&local_288[lVar14].m_backend.fpclass = local_2e8;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)(p_work + iVar19),0.0);
            piVar20 = local_228;
            pCVar38 = local_298;
            iVar17 = local_228[iVar19];
            if (local_1b0[iVar19] <= iVar17) {
              forestReMaxCol(local_298,iVar19,iVar17 + 1);
              local_258 = (pCVar38->u).col.idx;
              local_250 = (pCVar38->u).col.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              iVar17 = piVar20[iVar19];
            }
            local_2e0 = (uint *)CONCAT44(local_2e0._4_4_,(int)local_2e0 + 1);
            lVar14 = (long)iVar17 + (long)local_220[iVar19];
            *(ulong *)((long)local_250[lVar14].m_backend.data._M_elems + 0x20) =
                 CONCAT44(local_318._36_4_,local_318._32_4_);
            puVar1 = (uint *)((long)local_250[lVar14].m_backend.data._M_elems + 0x10);
            *(ulong *)puVar1 = CONCAT44(local_318._20_4_,local_318._16_4_);
            *(ulong *)(puVar1 + 2) = CONCAT44(local_318._28_4_,local_318._24_4_);
            *(ulong *)local_250[lVar14].m_backend.data._M_elems =
                 CONCAT44(local_318._4_4_,local_318._0_4_);
            *(ulong *)((long)local_250[lVar14].m_backend.data._M_elems + 8) =
                 CONCAT44(local_318._12_4_,local_318._8_4_);
            local_250[lVar14].m_backend.exp = local_318._40_4_;
            local_250[lVar14].m_backend.neg = (bool)local_318[0x2c];
            *(int **)&local_250[lVar14].m_backend.fpclass = local_2e8;
            iVar17 = local_220[iVar19];
            iVar28 = piVar20[iVar19];
            piVar20[iVar19] = iVar28 + 1;
            local_258[(long)iVar17 + (long)iVar28] = (int)local_1f8;
          }
          else {
            local_2a8._0_4_ = cpp_dec_float_finite;
            local_2a8._4_4_ = 10;
            local_2d8._0_16_ = ZEXT816(0);
            local_2d8._16_4_ = 0;
            local_2d8._20_4_ = 0;
            local_2d8._24_5_ = 0;
            local_2d8._29_3_ = 0;
            local_2d8._32_5_ = 0;
            local_2d8._37_3_ = 0;
            local_2d8._40_4_ = 0;
            local_2d8[0x2c] = (cpp_dec_float<50u,int,void>)0x0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2d8,0.0);
            iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_318,
                                (cpp_dec_float<50U,_int,_void> *)local_2d8);
            if (iVar17 != 0) {
              local_2a8._4_4_ = local_2e8._4_4_;
              local_2a8._0_4_ = (fpclass_type)local_2e8;
              goto LAB_002a7ca2;
            }
          }
          piVar34 = piVar34 + 1;
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)local_280);
        piVar34 = local_208;
        iVar13 = (int)local_2e0;
        iVar19 = local_218[local_230];
      }
      piVar34[local_230] = iVar13 - iVar19;
    }
  }
  *(ulong *)((local_298->maxabs).m_backend.data._M_elems + 8) =
       CONCAT44(local_1e8._36_4_,local_1e8._32_4_);
  *(ulong *)((local_298->maxabs).m_backend.data._M_elems + 4) =
       CONCAT44(local_1e8._20_4_,local_1e8._16_4_);
  *(ulong *)((local_298->maxabs).m_backend.data._M_elems + 6) =
       CONCAT44(local_1e8._28_4_,local_1e8._24_4_);
  *(ulong *)(local_298->maxabs).m_backend.data._M_elems = CONCAT44(local_1e8._4_4_,local_1e8._0_4_);
  *(ulong *)((local_298->maxabs).m_backend.data._M_elems + 2) =
       CONCAT44(local_1e8._12_4_,local_1e8._8_4_);
  (local_298->maxabs).m_backend.exp = local_1e8._40_4_;
  (local_298->maxabs).m_backend.neg = (bool)local_1e8[0x2c];
  (local_298->maxabs).m_backend.fpclass = local_1e8._48_4_;
  (local_298->maxabs).m_backend.prec_elem = local_1e8._52_4_;
  local_298->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::forestUpdate(int p_col, R* p_work, int num, int* nonz)
{
   int i, j, k, h, m, n;
   int ll, c, r, rowno;
   R x;

   R* lval;
   int* lidx;
   int* lbeg = l.start;

   R* cval;
   int* cidx = u.col.idx;
   int* cmax = u.col.max;
   int* clen = u.col.len;
   int* cbeg = u.col.start;

   R* rval = u.row.val.data();
   int* ridx = u.row.idx;
   int* rmax = u.row.max;
   int* rlen = u.row.len;
   int* rbeg = u.row.start;

   int* rperm = row.perm;
   int* rorig = row.orig;
   int* cperm = col.perm;
   int* corig = col.orig;

   R l_maxabs = maxabs;
   int dim = thedim;

   /*  Remove column p_col from U
    */
   j = cbeg[p_col];
   i = clen[p_col];
   nzCnt -= i;

   for(i += j - 1; i >= j; --i)
   {
      m = cidx[i];          // remove column p_col from row m
      k = rbeg[m];
      h = --(rlen[m]) + k;    // decrease length of row m

      while(ridx[k] != p_col)
         ++k;

      assert(k <= h);       // k is the position of p_col, h is last position

      ridx[k] = ridx[h];    // store last index at the position of p_col

      rval[k] = rval[h];
   }

   /*  Insert new VectorBase<R> column p_col thereby determining the highest permuted
    *       row index r.
    *
    *       Distinguish between optimized call (num > 0, nonz != 0) and
    *       non-optimized one.
    */
   assert(num);   // otherwise the assert( nonz != 0 ) below should fail

   if(num)
   {
      // Optimized call.
      assert(nonz != nullptr);

      clen[p_col] = 0;

      if(num > cmax[p_col])
         forestReMaxCol(p_col, num);

      cidx = u.col.idx;

      cval = u.col.val.data();

      k = cbeg[p_col];

      r = 0;

      for(j = 0; j < num; ++j)
      {
         i = nonz[j];
         x = p_work[i];
         p_work[i] = 0.0;

         if(isNotZero(x, R(_tolerances->epsilonUpdate())))
         {
            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            /* insert to column file */
            assert(k - cbeg[p_col] < cmax[p_col]);

            cval[k] = x;

            cidx[k++] = i;

            /* insert to row file */
            if(rmax[i] <= rlen[i])
            {
               remaxRow(i, rlen[i] + 1);
               rval = u.row.val.data();
               ridx = u.row.idx;
            }

            h = rbeg[i] + (rlen[i])++;

            rval[h] = x;
            ridx[h] = p_col;

            /* check permuted row index */

            if(rperm[i] > r)
               r = rperm[i];
         }
      }

      nzCnt += (clen[p_col] = k - cbeg[p_col]);
   }
   else
   {
      // Non-optimized call: We have to access all elements of p_work.
      assert(nonz == nullptr);

      /*
       *      clen[col] = 0;
       *      reMaxCol(fac, col, dim);
       */
      cidx = u.col.idx;
      cval = u.col.val.data();
      k = cbeg[p_col];
      j = k + cmax[p_col];
      r = 0;

      for(i = 0; i < dim; ++i)
      {
         x = p_work[i];
         p_work[i] = 0.0;

         if(isNotZero(x, R(_tolerances->epsilonUpdate())))
         {
            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            /* insert to column file */
            if(k >= j)
            {
               clen[p_col] = k - cbeg[p_col];
               forestReMaxCol(p_col, dim - i);
               cidx = u.col.idx;
               cval = u.col.val.data();
               k = cbeg[p_col];
               j = k + cmax[p_col];
               k += clen[p_col];
            }

            assert(k - cbeg[p_col] < cmax[p_col]);

            cval[k] = x;
            cidx[k++] = i;

            /* insert to row file */

            if(rmax[i] <= rlen[i])
            {
               remaxRow(i, rlen[i] + 1);
               rval = u.row.val.data();
               ridx = u.row.idx;
            }

            h = rbeg[i] + (rlen[i])++;

            rval[h] = x;
            ridx[h] = p_col;

            /* check permuted row index */

            if(rperm[i] > r)
               r = rperm[i];
         }
      }

      nzCnt += (clen[p_col] = k - cbeg[p_col]);

      if(cbeg[p_col] + cmax[p_col] == u.col.used)
      {
         u.col.used -= cmax[p_col];
         cmax[p_col] = clen[p_col];
         u.col.used += cmax[p_col];
      }
   }

   c = cperm[p_col];

   if(r > c)                          /* Forest Tomlin update */
   {
      /*      update permutations
       */
      j = rorig[c];

      // memmove is more efficient than a for loop
      // for ( i = c; i < r; ++i )
      //    rorig[i] = rorig[i + 1];
      memmove(&rorig[c], &rorig[c + 1], (unsigned int)(r - c) * sizeof(int));

      rorig[r] = j;

      for(i = c; i <= r; ++i)
         rperm[rorig[i]] = i;

      j = corig[c];

      // memmove is more efficient than a for loop
      // for ( i = c; i < r; ++i )
      //    corig[i] = corig[i + 1];
      memmove(&corig[c], &corig[c + 1], (unsigned int)(r - c) * sizeof(int));

      corig[r] = j;

      for(i = c; i <= r; ++i)
         cperm[corig[i]] = i;


      rowno = rorig[r];

      j = rbeg[rowno];

      i = rlen[rowno];

      nzCnt -= i;

      if(i < verySparseFactor * (dim - c))      // few nonzeros to be eliminated
      {
         /**
          *          The following assert is obviously violated if this method is called
          *          with nonzero==0.
          *
          *          @todo Use an extra member variable as a buffer for the heap instead of
          *                misusing nonz and num. The method enQueueMin() seems to
          *                sort the nonzeros or something, for which it only needs
          *                some empty VectorBase<R> of size num.
          */
         assert(nonz != nullptr);

         /*  move row r from U to p_work
          */
         num = 0;

         for(i += j - 1; i >= j; --i)
         {
            k = ridx[i];
            p_work[k] = rval[i];
            enQueueMin(nonz, &num, cperm[k]);
            m = --(clen[k]) + cbeg[k];

            for(h = m; cidx[h] != rowno; --h)
               ;

            cidx[h] = cidx[m];

            cval[h] = cval[m];
         }


         /*  Eliminate row r from U to L file
          */
         ll = makeLvec(r - c, rowno);

         lval = l.val.data();

         lidx = l.idx;

         assert((num == 0) || (nonz != nullptr));

         /* for(i = c; i < r; ++i)       */
         while(num)
         {
#ifndef NDEBUG
            // The numbers seem to be often 1e-100, is this ok ?

            for(i = 0; i < num; ++i)
               assert(p_work[corig[nonz[i]]] != 0.0);

#endif // NDEBUG
            i = deQueueMin(nonz, &num);

            if(i == r)
               break;

            k = corig[i];

            assert(p_work[k] != 0.0);

            n = rorig[i];

            x = p_work[k] * diag[n];

            lidx[ll] = n;

            lval[ll] = x;

            p_work[k] = 0.0;

            ll++;

            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            j = rbeg[n];

            m = rlen[n] + j;

            for(; j < m; ++j)
            {
               int jj = ridx[j];
               R y = p_work[jj];

               if(y == 0)
                  enQueueMin(nonz, &num, cperm[jj]);

               y -= x * rval[j];

               p_work[jj] = y + ((y == 0) ? SOPLEX_FACTOR_MARKER : 0.0);
            }
         }

         if(lbeg[l.firstUnused - 1] == ll)
            (l.firstUnused)--;
         else
            lbeg[l.firstUnused] = ll;


         /*  Set diagonal value
          */
         if(i != r)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            throw SPxStatusException("XFORE01 The loaded matrix is singular");
         }

         k = corig[r];

         x = p_work[k];
         diag[rowno] = 1 / x;
         p_work[k] = 0.0;


         /*  make row large enough to fit all nonzeros.
          */

         if(rmax[rowno] < num)
         {
            rlen[rowno] = 0;
            remaxRow(rowno, num);
            rval = u.row.val.data();
            ridx = u.row.idx;
         }

         nzCnt += num;

         /*  Insert work to updated row thereby clearing work;
          */
         n = rbeg[rowno];

         for(i = 0; i < num; ++i)
         {
            j = corig[nonz[i]];
            x = p_work[j];

            // BH 2005-08-24: This if is very important. It may well happen that
            // during the elimination of row r a nonzero elements cancels out
            // and becomes zero. This would lead to an infinite loop in the
            // above elimination code, since the corresponding column index would
            // be enqueued for further elimination again and agian.

            if(x != 0.0)
            {
               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               ridx[n] = j;

               rval[n] = x;

               p_work[j] = 0.0;

               ++n;

               if(clen[j] >= cmax[j])
               {
                  forestReMaxCol(j, clen[j] + 1);
                  cidx = u.col.idx;
                  cval = u.col.val.data();
               }

               cval[cbeg[j] + clen[j]] = x;

               cidx[cbeg[j] + clen[j]++] = rowno;
            }
         }

         rlen[rowno] = n - rbeg[rowno];
      }
      else            /* few nonzeros to be eliminated        */
      {
         /*  move row r from U to p_work
          */
         for(i += j - 1; i >= j; --i)
         {
            k = ridx[i];
            p_work[k] = rval[i];
            m = --(clen[k]) + cbeg[k];

            for(h = m; cidx[h] != rowno; --h)
               ;

            cidx[h] = cidx[m];

            cval[h] = cval[m];
         }


         /*  Eliminate row r from U to L file
          */
         ll = makeLvec(r - c, rowno);

         lval = l.val.data();

         lidx = l.idx;

         for(i = c; i < r; ++i)
         {
            k = corig[i];

            if(p_work[k] != 0.0)
            {
               n = rorig[i];
               x = p_work[k] * diag[n];
               lidx[ll] = n;
               lval[ll] = x;
               p_work[k] = 0.0;
               ll++;

               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               j = rbeg[n];

               m = rlen[n] + j;

               for(; j < m; ++j)
                  p_work[ridx[j]] -= x * rval[j];
            }
         }

         if(lbeg[l.firstUnused - 1] == ll)
            (l.firstUnused)--;
         else
            lbeg[l.firstUnused] = ll;


         /*  Set diagonal value
          */
         k = corig[r];

         x = p_work[k];

         if(x == 0.0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            throw SPxStatusException("XFORE02 The loaded matrix is singular");
            //            return;
         }

         diag[rowno] = 1 / x;

         p_work[k] = 0.0;


         /*  count remaining nonzeros in work and make row large enough
          *  to fit them all.
          */
         n = 0;

         for(i = r + 1; i < dim; ++i)
            if(p_work[corig[i]] != 0.0)
               n++;

         if(rmax[rowno] < n)
         {
            rlen[rowno] = 0;
            remaxRow(rowno, n);
            rval = u.row.val.data();
            ridx = u.row.idx;
         }

         nzCnt += n;

         /*  Insert p_work to updated row thereby clearing p_work;
          */
         n = rbeg[rowno];

         for(i = r + 1; i < dim; ++i)
         {
            j = corig[i];
            x = p_work[j];

            if(x != 0.0)
            {
               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               ridx[n] = j;

               rval[n] = x;

               p_work[j] = 0.0;

               ++n;

               if(clen[j] >= cmax[j])
               {
                  forestReMaxCol(j, clen[j] + 1);
                  cidx = u.col.idx;
                  cval = u.col.val.data();
               }

               cval[cbeg[j] + clen[j]] = x;

               cidx[cbeg[j] + clen[j]++] = rowno;
            }
         }

         rlen[rowno] = n - rbeg[rowno];
      }
   }

   else if(r == c)
   {
      /*  Move diagonal element to diag.  Note, that it must be the last
       *  element, since it has just been inserted above.
       */
      rowno = rorig[r];
      i = rbeg[rowno] + --(rlen[rowno]);
      diag[rowno] = 1 / rval[i];

      for(j = i = --(clen[p_col]) + cbeg[p_col]; cidx[i] != rowno; --i)
         ;

      cidx[i] = cidx[j];

      cval[i] = cval[j];
   }
   else /* r < c */
   {
      this->stat = SLinSolver<R>::SINGULAR;
      throw SPxStatusException("XFORE03 The loaded matrix is singular");
      //      return;
   }

   maxabs = l_maxabs;

   assert(isConsistent());
   this->stat = SLinSolver<R>::OK;
}